

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lexer.cpp
# Opt level: O0

void basic_tests(void)

{
  pointer *pptVar1;
  allocator<mjs::token> *paVar2;
  initializer_list<mjs::token> __l;
  initializer_list<mjs::token> __l_00;
  initializer_list<mjs::token> __l_01;
  initializer_list<mjs::token> __l_02;
  initializer_list<mjs::token> __l_03;
  initializer_list<mjs::token> __l_04;
  initializer_list<mjs::token> __l_05;
  initializer_list<mjs::token> __l_06;
  initializer_list<mjs::token> __l_07;
  initializer_list<mjs::token> __l_08;
  initializer_list<mjs::token> __l_09;
  initializer_list<mjs::token> __l_10;
  initializer_list<mjs::token> __l_11;
  initializer_list<mjs::token> __l_12;
  initializer_list<mjs::token> __l_13;
  initializer_list<mjs::token> __l_14;
  initializer_list<mjs::token> __l_15;
  initializer_list<mjs::token> __l_16;
  initializer_list<mjs::token> __l_17;
  initializer_list<mjs::token> __l_18;
  initializer_list<mjs::token> __l_19;
  initializer_list<mjs::token> __l_20;
  initializer_list<mjs::token> __l_21;
  initializer_list<mjs::token> __l_22;
  initializer_list<mjs::token> __l_23;
  initializer_list<mjs::token> __l_24;
  initializer_list<mjs::token> __l_25;
  initializer_list<mjs::token> __l_26;
  initializer_list<mjs::token> __l_27;
  initializer_list<mjs::token> __l_28;
  initializer_list<mjs::token> __l_29;
  initializer_list<mjs::token> __l_30;
  initializer_list<mjs::token> __l_31;
  initializer_list<mjs::token> __l_32;
  initializer_list<mjs::token> __l_33;
  initializer_list<mjs::token> __l_34;
  initializer_list<mjs::token> __l_35;
  initializer_list<mjs::token> __l_36;
  initializer_list<mjs::token> __l_37;
  initializer_list<mjs::token> __l_38;
  bool bVar3;
  version vVar4;
  wostream *pwVar5;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar6;
  token *local_41d0;
  token *local_40c8;
  token *local_3fe8;
  token *local_3f08;
  token *local_3e28;
  token *local_3d48;
  token *local_3c68;
  token *local_3b88;
  token *local_3aa8;
  token *local_39c8;
  token *local_38f0;
  token *local_3818;
  token *local_3740;
  token *local_3668;
  token *local_3590;
  token *local_34b8;
  token *local_33e0;
  token *local_3308;
  token *local_3230;
  token *local_3158;
  token *local_3080;
  token *local_2fa8;
  token *local_2ed0;
  token *local_2df8;
  token *local_2d20;
  token *local_2c48;
  token *local_2b70;
  token *local_2a88;
  token *local_2988;
  token *local_2888;
  token *local_27a0;
  token *local_26c8;
  token *local_25e8;
  token *local_2508;
  token *local_2430;
  token *local_2358;
  token *local_2278;
  token *local_21a0;
  token *local_20b8;
  token *local_1fe0;
  allocator<mjs::token> local_1fb3;
  undefined1 local_1fb2;
  allocator<wchar_t> local_1fb1;
  wstring local_1fb0;
  allocator<wchar_t> local_1f89;
  wstring local_1f88;
  allocator<wchar_t> local_1f61;
  wstring local_1f60;
  token *local_1f40;
  token local_1f38;
  token local_1f10;
  token local_1ee8;
  token local_1ec0;
  token local_1e98;
  token local_1e70;
  token local_1e48;
  token local_1e20;
  token local_1df8;
  token local_1dd0;
  token local_1da8;
  token local_1d80;
  token local_1d58;
  token local_1d30;
  token local_1d08;
  iterator local_1ce0;
  undefined1 local_1cd8 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_39;
  undefined1 local_1ca8 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_39;
  wstring local_1c88;
  token *local_1c68;
  token local_1c60;
  iterator local_1c38;
  undefined1 local_1c30 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_38;
  undefined1 local_1c00 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_38;
  wstring local_1be0;
  token *local_1bc0;
  token local_1bb8;
  iterator local_1b90;
  undefined1 local_1b88 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_37;
  undefined1 local_1b58 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_37;
  wstring local_1b38;
  token *local_1b18;
  token local_1b10;
  iterator local_1ae8;
  undefined1 local_1ae0 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_36;
  undefined1 local_1ab0 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_36;
  wstring local_1a90;
  token *local_1a70;
  token local_1a68;
  iterator local_1a40;
  undefined1 local_1a38 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_35;
  undefined1 local_1a08 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_35;
  string local_19e0;
  wchar_t *local_19c0;
  wchar_t *vert_tab_str;
  wstring local_19b0;
  token *local_1990;
  token local_1988;
  iterator local_1960;
  undefined1 local_1958 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_34;
  undefined1 local_1928 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_34;
  string local_1900;
  wchar_t *local_18e0;
  wchar_t *line_continuation;
  string local_18c8;
  allocator<mjs::token> local_18a3;
  undefined1 local_18a2;
  allocator<wchar_t> local_18a1;
  wstring local_18a0;
  token *local_1880;
  token local_1878;
  iterator local_1850;
  undefined1 local_1848 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_33;
  undefined1 local_1818 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_33;
  wstring local_17f8;
  token *local_17d8;
  token local_17d0;
  iterator local_17a8;
  undefined1 local_17a0 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_32;
  undefined1 local_1770 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_32;
  wstring local_1750;
  token *local_1730;
  token local_1728;
  iterator local_1700;
  undefined1 local_16f8 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_31;
  undefined1 local_16c8 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_31;
  token local_16a0;
  iterator local_1678;
  undefined1 local_1670 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_30;
  undefined1 local_1640 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_30;
  token local_1618;
  iterator local_15f0;
  undefined1 local_15e8 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_29;
  undefined1 local_15b8 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_29;
  token local_1590;
  iterator local_1568;
  undefined1 local_1560 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_28;
  undefined1 local_1530 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_28;
  token local_1508;
  iterator local_14e0;
  undefined1 local_14d8 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_27;
  undefined1 local_14a8 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_27;
  token local_1480;
  iterator local_1458;
  undefined1 local_1450 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_26;
  undefined1 local_1420 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_26;
  token local_13f8;
  iterator local_13d0;
  undefined1 local_13c8 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_25;
  undefined1 local_1398 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_25;
  token local_1370;
  iterator local_1348;
  undefined1 local_1340 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_24;
  undefined1 local_1310 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_24;
  token local_12e8;
  iterator local_12c0;
  undefined1 local_12b8 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_23;
  undefined1 local_1288 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_23;
  token local_1260;
  iterator local_1238;
  undefined1 local_1230 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_22;
  undefined1 local_1200 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_22;
  token local_11d8;
  iterator local_11b0;
  undefined1 local_11a8 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_21;
  undefined1 local_1178 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_21;
  token local_1150;
  iterator local_1128;
  undefined1 local_1120 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_20;
  undefined1 local_10f0 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_20;
  token local_10c8;
  iterator local_10a0;
  undefined1 local_1098 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_19;
  undefined1 local_1068 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_19;
  token local_1040;
  iterator local_1018;
  undefined1 local_1010 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_18;
  undefined1 local_fe0 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_18;
  token local_fb8;
  token local_f90;
  token local_f68;
  token local_f40;
  token local_f18;
  iterator local_ef0;
  undefined1 local_ee8 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_17;
  undefined1 local_eb8 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_17;
  token local_e90;
  token local_e68;
  iterator local_e40;
  undefined1 local_e38 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_16;
  undefined1 local_e08 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_16;
  token local_de0;
  token local_db8;
  token local_d90;
  token local_d68;
  token local_d40;
  token local_d18;
  iterator local_cf0;
  undefined1 local_ce8 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_15;
  undefined1 local_cb8 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_15;
  token local_c90;
  token local_c68;
  iterator local_c40;
  undefined1 local_c38 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_14;
  undefined1 local_c08 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_14;
  wstring local_be8;
  token *local_bc8;
  token local_bc0;
  token local_b98;
  iterator local_b70;
  undefined1 local_b68 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_13;
  undefined1 local_b38 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_13;
  wstring local_b18;
  allocator<wchar_t> local_af1;
  wstring local_af0;
  allocator<wchar_t> local_ac9;
  wstring local_ac8;
  token *local_aa8;
  token local_aa0;
  token local_a78;
  token local_a50;
  token local_a28;
  token local_a00;
  iterator local_9d8;
  undefined1 local_9d0 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_12;
  undefined1 local_9a0 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_12;
  wstring local_980;
  allocator<wchar_t> local_959;
  wstring local_958;
  allocator<wchar_t> local_931;
  wstring local_930;
  token *local_910;
  token local_908;
  token local_8e0;
  token local_8b8;
  token local_890;
  token local_868;
  iterator local_840;
  undefined1 local_838 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_11;
  undefined1 local_808 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_11;
  wstring local_7e8;
  token *local_7c8;
  token local_7c0;
  iterator local_798;
  undefined1 local_790 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_10;
  undefined1 local_760 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_10;
  token local_738;
  iterator local_710;
  undefined1 local_708 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_9;
  undefined1 local_6d8 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_9;
  wstring local_6b8;
  token *local_698;
  token local_690;
  token local_668;
  token local_640;
  iterator local_618;
  undefined1 local_610 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_8;
  undefined1 local_5e0 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_8;
  wstring local_5c0;
  token *local_5a0;
  token local_598;
  token local_570;
  iterator local_548;
  undefined1 local_540 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_7;
  undefined1 local_510 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_7;
  token local_4e8;
  iterator local_4c0;
  undefined1 local_4b8 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_6;
  undefined1 local_488 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_6;
  token local_460;
  iterator local_438;
  undefined1 local_430 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_5;
  undefined1 local_400 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_5;
  wstring local_3e0;
  token *local_3c0;
  token local_3b8;
  token local_390;
  token local_368;
  iterator local_340;
  undefined1 local_338 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_4;
  undefined1 local_308 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_4;
  token local_2e0;
  iterator local_2b8;
  undefined1 local_2b0 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_3;
  undefined1 local_280 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_3;
  wstring local_260;
  token *local_240;
  token local_238;
  token local_210;
  token local_1e8;
  iterator local_1c0;
  undefined1 local_1b8 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_2;
  undefined1 local_188 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_2;
  token local_160;
  iterator local_138;
  undefined1 local_130 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_1;
  undefined1 local_100 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_1;
  wstring local_e0;
  token *local_b0;
  token local_a8;
  token local_80;
  iterator local_58;
  undefined1 local_50 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r;
  undefined1 local_20 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l;
  
  pptVar1 = &_r.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"\t\v\f  ab");
  lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_20,(wstring_view *)pptVar1);
  _l_1.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 1;
  local_b0 = &local_a8;
  mjs::token::token(local_b0,whitespace);
  local_b0 = &local_80;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_e0,L"ab",
             (allocator<wchar_t> *)
             ((long)&_l_1.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  mjs::token::token(&local_80,identifier,&local_e0);
  _l_1.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 0;
  local_58 = &local_a8;
  local_50._0_8_ = 2;
  paVar2 = (allocator<mjs::token> *)
           ((long)&_l_1.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<mjs::token>::allocator(paVar2);
  __l_38._M_len = local_50._0_8_;
  __l_38._M_array = local_58;
  std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_50 + 8),__l_38,paVar2);
  std::allocator<mjs::token>::~allocator
            ((allocator<mjs::token> *)
             ((long)&_l_1.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 5));
  local_1fe0 = (token *)&local_58;
  do {
    local_1fe0 = local_1fe0 + -1;
    mjs::token::~token(local_1fe0);
  } while (local_1fe0 != &local_a8);
  std::__cxx11::wstring::~wstring((wstring *)&local_e0);
  std::allocator<wchar_t>::~allocator
            ((allocator<wchar_t> *)
             ((long)&_l_1.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_20,
                          (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_50 + 8));
  if (bVar3) {
    pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
    pwVar5 = std::operator<<(pwVar5," in ");
    pwVar5 = std::operator<<(pwVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                            );
    pwVar5 = std::operator<<(pwVar5,":");
    pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0x33);
    pwVar5 = std::operator<<(pwVar5,":\n");
    pwVar5 = std::operator<<(pwVar5,"lex(L\"\\x09\\x0b\\x0c\\x20 ab\")");
    pwVar5 = std::operator<<(pwVar5," != ");
    pwVar5 = std::operator<<(pwVar5,
                             "TOKENS(token{token_type::whitespace}, token{token_type::identifier, L\"ab\"})"
                            );
    pwVar5 = std::operator<<(pwVar5,"\n");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_20);
    pwVar5 = std::operator<<(pbVar6," != ");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_50 + 8));
    pwVar5 = std::operator<<(pbVar6,"\n");
    vVar4 = tested_version();
    pbVar6 = mjs::operator<<(pwVar5,vVar4);
    std::operator<<(pbVar6,"\n");
    abort();
  }
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_50 + 8));
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_20);
  vVar4 = tested_version();
  if (0 < (int)vVar4) {
    pptVar1 = &_r_1.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"\xa0\x1680\x2000"
              );
    lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_100,(wstring_view *)pptVar1);
    mjs::token::token(&local_160,whitespace);
    local_138 = &local_160;
    local_130._0_8_ = 1;
    paVar2 = (allocator<mjs::token> *)
             ((long)&_l_2.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<mjs::token>::allocator(paVar2);
    __l_37._M_len = local_130._0_8_;
    __l_37._M_array = local_138;
    std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_130 + 8),__l_37,paVar2);
    std::allocator<mjs::token>::~allocator
              ((allocator<mjs::token> *)
               ((long)&_l_2.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    local_20b8 = (token *)&local_138;
    do {
      local_20b8 = local_20b8 + -1;
      mjs::token::~token(local_20b8);
    } while (local_20b8 != &local_160);
    bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_100,
                            (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_130 + 8));
    if (bVar3) {
      pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
      pwVar5 = std::operator<<(pwVar5," in ");
      pwVar5 = std::operator<<(pwVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                              );
      pwVar5 = std::operator<<(pwVar5,":");
      pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0x36);
      pwVar5 = std::operator<<(pwVar5,":\n");
      pwVar5 = std::operator<<(pwVar5,"lex(L\"\\xA0\\x1680\\x2000\")");
      pwVar5 = std::operator<<(pwVar5," != ");
      pwVar5 = std::operator<<(pwVar5,"TOKENS(token{token_type::whitespace})");
      pwVar5 = std::operator<<(pwVar5,"\n");
      pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_100);
      pwVar5 = std::operator<<(pbVar6," != ");
      pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_130 + 8))
      ;
      pwVar5 = std::operator<<(pbVar6,"\n");
      vVar4 = tested_version();
      pbVar6 = mjs::operator<<(pwVar5,vVar4);
      std::operator<<(pbVar6,"\n");
      abort();
    }
    std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_130 + 8));
    std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_100);
  }
  pptVar1 = &_r_2.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"\nx\r");
  lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_188,(wstring_view *)pptVar1);
  _l_3.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 1;
  local_240 = &local_238;
  mjs::token::token(local_240,line_terminator);
  local_240 = &local_210;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_260,L"x",
             (allocator<wchar_t> *)
             ((long)&_l_3.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  mjs::token::token(&local_210,identifier,&local_260);
  local_240 = &local_1e8;
  mjs::token::token(local_240,line_terminator);
  _l_3.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 0;
  local_1c0 = &local_238;
  local_1b8._0_8_ = 3;
  paVar2 = (allocator<mjs::token> *)
           ((long)&_l_3.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<mjs::token>::allocator(paVar2);
  __l_36._M_len = local_1b8._0_8_;
  __l_36._M_array = local_1c0;
  std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1b8 + 8),__l_36,paVar2);
  std::allocator<mjs::token>::~allocator
            ((allocator<mjs::token> *)
             ((long)&_l_3.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 5));
  local_21a0 = (token *)&local_1c0;
  do {
    local_21a0 = local_21a0 + -1;
    mjs::token::~token(local_21a0);
  } while (local_21a0 != &local_238);
  std::__cxx11::wstring::~wstring((wstring *)&local_260);
  std::allocator<wchar_t>::~allocator
            ((allocator<wchar_t> *)
             ((long)&_l_3.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_188,
                          (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1b8 + 8));
  if (bVar3) {
    pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
    pwVar5 = std::operator<<(pwVar5," in ");
    pwVar5 = std::operator<<(pwVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                            );
    pwVar5 = std::operator<<(pwVar5,":");
    pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0x39);
    pwVar5 = std::operator<<(pwVar5,":\n");
    pwVar5 = std::operator<<(pwVar5,"lex(L\"\\012x\\015\")");
    pwVar5 = std::operator<<(pwVar5," != ");
    pwVar5 = std::operator<<(pwVar5,
                             "TOKENS(token{token_type::line_terminator}, token{token_type::identifier, L\"x\"}, token{token_type::line_terminator})"
                            );
    pwVar5 = std::operator<<(pwVar5,"\n");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_188);
    pwVar5 = std::operator<<(pbVar6," != ");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1b8 + 8));
    pwVar5 = std::operator<<(pbVar6,"\n");
    vVar4 = tested_version();
    pbVar6 = mjs::operator<<(pwVar5,vVar4);
    std::operator<<(pbVar6,"\n");
    abort();
  }
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1b8 + 8));
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_188);
  vVar4 = tested_version();
  if (0 < (int)vVar4) {
    pptVar1 = &_r_3.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"\x2028\x2029");
    lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_280,(wstring_view *)pptVar1);
    mjs::token::token(&local_2e0,line_terminator);
    local_2b8 = &local_2e0;
    local_2b0._0_8_ = 1;
    paVar2 = (allocator<mjs::token> *)
             ((long)&_l_4.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<mjs::token>::allocator(paVar2);
    __l_35._M_len = local_2b0._0_8_;
    __l_35._M_array = local_2b8;
    std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_2b0 + 8),__l_35,paVar2);
    std::allocator<mjs::token>::~allocator
              ((allocator<mjs::token> *)
               ((long)&_l_4.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    local_2278 = (token *)&local_2b8;
    do {
      local_2278 = local_2278 + -1;
      mjs::token::~token(local_2278);
    } while (local_2278 != &local_2e0);
    bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_280,
                            (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_2b0 + 8));
    if (bVar3) {
      pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
      pwVar5 = std::operator<<(pwVar5," in ");
      pwVar5 = std::operator<<(pwVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                              );
      pwVar5 = std::operator<<(pwVar5,":");
      pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0x3c);
      pwVar5 = std::operator<<(pwVar5,":\n");
      pwVar5 = std::operator<<(pwVar5,"lex(L\"\\x2028\\x2029\")");
      pwVar5 = std::operator<<(pwVar5," != ");
      pwVar5 = std::operator<<(pwVar5,"TOKENS(token{token_type::line_terminator})");
      pwVar5 = std::operator<<(pwVar5,"\n");
      pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_280);
      pwVar5 = std::operator<<(pbVar6," != ");
      pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_2b0 + 8))
      ;
      pwVar5 = std::operator<<(pbVar6,"\n");
      vVar4 = tested_version();
      pbVar6 = mjs::operator<<(pwVar5,vVar4);
      std::operator<<(pbVar6,"\n");
      abort();
    }
    std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_2b0 + 8));
    std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_280);
    pptVar1 = &_r_4.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"x//\x2029");
    lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_308,(wstring_view *)pptVar1);
    _l_5.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage._6_1_ = 1;
    local_3c0 = &local_3b8;
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)&local_3e0,L"x",
               (allocator<wchar_t> *)
               ((long)&_l_5.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    mjs::token::token(&local_3b8,identifier,&local_3e0);
    local_3c0 = &local_390;
    mjs::token::token(local_3c0,whitespace);
    local_3c0 = &local_368;
    mjs::token::token(local_3c0,line_terminator);
    _l_5.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage._6_1_ = 0;
    local_340 = &local_3b8;
    local_338._0_8_ = 3;
    paVar2 = (allocator<mjs::token> *)
             ((long)&_l_5.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 5);
    std::allocator<mjs::token>::allocator(paVar2);
    __l_34._M_len = local_338._0_8_;
    __l_34._M_array = local_340;
    std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_338 + 8),__l_34,paVar2);
    std::allocator<mjs::token>::~allocator
              ((allocator<mjs::token> *)
               ((long)&_l_5.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 5));
    local_2358 = (token *)&local_340;
    do {
      local_2358 = local_2358 + -1;
      mjs::token::~token(local_2358);
    } while (local_2358 != &local_3b8);
    std::__cxx11::wstring::~wstring((wstring *)&local_3e0);
    std::allocator<wchar_t>::~allocator
              ((allocator<wchar_t> *)
               ((long)&_l_5.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_308,
                            (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_338 + 8));
    if (bVar3) {
      pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
      pwVar5 = std::operator<<(pwVar5," in ");
      pwVar5 = std::operator<<(pwVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                              );
      pwVar5 = std::operator<<(pwVar5,":");
      pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0x3d);
      pwVar5 = std::operator<<(pwVar5,":\n");
      pwVar5 = std::operator<<(pwVar5,"lex(L\"x//\\x2029\")");
      pwVar5 = std::operator<<(pwVar5," != ");
      pwVar5 = std::operator<<(pwVar5,
                               "TOKENS(token{token_type::identifier, L\"x\"}, token{token_type::whitespace}, token{token_type::line_terminator})"
                              );
      pwVar5 = std::operator<<(pwVar5,"\n");
      pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_308);
      pwVar5 = std::operator<<(pbVar6," != ");
      pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_338 + 8))
      ;
      pwVar5 = std::operator<<(pbVar6,"\n");
      vVar4 = tested_version();
      pbVar6 = mjs::operator<<(pwVar5,vVar4);
      std::operator<<(pbVar6,"\n");
      abort();
    }
    std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_338 + 8));
    std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_308);
  }
  pptVar1 = &_r_5.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"/*hello world!*/");
  lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_400,(wstring_view *)pptVar1);
  mjs::token::token(&local_460,whitespace);
  local_438 = &local_460;
  local_430._0_8_ = 1;
  paVar2 = (allocator<mjs::token> *)
           ((long)&_l_6.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<mjs::token>::allocator(paVar2);
  __l_33._M_len = local_430._0_8_;
  __l_33._M_array = local_438;
  std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_430 + 8),__l_33,paVar2);
  std::allocator<mjs::token>::~allocator
            ((allocator<mjs::token> *)
             ((long)&_l_6.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_2430 = (token *)&local_438;
  do {
    local_2430 = local_2430 + -1;
    mjs::token::~token(local_2430);
  } while (local_2430 != &local_460);
  bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_400,
                          (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_430 + 8));
  if (bVar3) {
    pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
    pwVar5 = std::operator<<(pwVar5," in ");
    pwVar5 = std::operator<<(pwVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                            );
    pwVar5 = std::operator<<(pwVar5,":");
    pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0x40);
    pwVar5 = std::operator<<(pwVar5,":\n");
    pwVar5 = std::operator<<(pwVar5,"lex(L\"/*hello world!*/\")");
    pwVar5 = std::operator<<(pwVar5," != ");
    pwVar5 = std::operator<<(pwVar5,"TOKENS(token{token_type::whitespace})");
    pwVar5 = std::operator<<(pwVar5,"\n");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_400);
    pwVar5 = std::operator<<(pbVar6," != ");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_430 + 8));
    pwVar5 = std::operator<<(pbVar6,"\n");
    vVar4 = tested_version();
    pbVar6 = mjs::operator<<(pwVar5,vVar4);
    std::operator<<(pbVar6,"\n");
    abort();
  }
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_430 + 8));
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_400);
  pptVar1 = &_r_6.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"/*hello\nworld!*/")
  ;
  lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_488,(wstring_view *)pptVar1);
  mjs::token::token(&local_4e8,line_terminator);
  local_4c0 = &local_4e8;
  local_4b8._0_8_ = 1;
  paVar2 = (allocator<mjs::token> *)
           ((long)&_l_7.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<mjs::token>::allocator(paVar2);
  __l_32._M_len = local_4b8._0_8_;
  __l_32._M_array = local_4c0;
  std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_4b8 + 8),__l_32,paVar2);
  std::allocator<mjs::token>::~allocator
            ((allocator<mjs::token> *)
             ((long)&_l_7.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_2508 = (token *)&local_4c0;
  do {
    local_2508 = local_2508 + -1;
    mjs::token::~token(local_2508);
  } while (local_2508 != &local_4e8);
  bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_488,
                          (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_4b8 + 8));
  if (bVar3) {
    pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
    pwVar5 = std::operator<<(pwVar5," in ");
    pwVar5 = std::operator<<(pwVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                            );
    pwVar5 = std::operator<<(pwVar5,":");
    pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0x41);
    pwVar5 = std::operator<<(pwVar5,":\n");
    pwVar5 = std::operator<<(pwVar5,"lex(L\"/*hello\\nworld!*/\")");
    pwVar5 = std::operator<<(pwVar5," != ");
    pwVar5 = std::operator<<(pwVar5,"TOKENS(token{token_type::line_terminator})");
    pwVar5 = std::operator<<(pwVar5,"\n");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_488);
    pwVar5 = std::operator<<(pbVar6," != ");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_4b8 + 8));
    pwVar5 = std::operator<<(pbVar6,"\n");
    vVar4 = tested_version();
    pbVar6 = mjs::operator<<(pwVar5,vVar4);
    std::operator<<(pbVar6,"\n");
    abort();
  }
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_4b8 + 8));
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_488);
  pptVar1 = &_r_7.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"x//test");
  lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_510,(wstring_view *)pptVar1);
  _l_8.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 1;
  local_5a0 = &local_598;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_5c0,L"x",
             (allocator<wchar_t> *)
             ((long)&_l_8.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  mjs::token::token(&local_598,identifier,&local_5c0);
  local_5a0 = &local_570;
  mjs::token::token(local_5a0,whitespace);
  _l_8.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 0;
  local_548 = &local_598;
  local_540._0_8_ = 2;
  paVar2 = (allocator<mjs::token> *)
           ((long)&_l_8.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<mjs::token>::allocator(paVar2);
  __l_31._M_len = local_540._0_8_;
  __l_31._M_array = local_548;
  std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_540 + 8),__l_31,paVar2);
  std::allocator<mjs::token>::~allocator
            ((allocator<mjs::token> *)
             ((long)&_l_8.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 5));
  local_25e8 = (token *)&local_548;
  do {
    local_25e8 = local_25e8 + -1;
    mjs::token::~token(local_25e8);
  } while (local_25e8 != &local_598);
  std::__cxx11::wstring::~wstring((wstring *)&local_5c0);
  std::allocator<wchar_t>::~allocator
            ((allocator<wchar_t> *)
             ((long)&_l_8.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_510,
                          (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_540 + 8));
  if (bVar3) {
    pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
    pwVar5 = std::operator<<(pwVar5," in ");
    pwVar5 = std::operator<<(pwVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                            );
    pwVar5 = std::operator<<(pwVar5,":");
    pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0x42);
    pwVar5 = std::operator<<(pwVar5,":\n");
    pwVar5 = std::operator<<(pwVar5,"lex(L\"x//test\")");
    pwVar5 = std::operator<<(pwVar5," != ");
    pwVar5 = std::operator<<(pwVar5,
                             "TOKENS(token{token_type::identifier, L\"x\"}, token{token_type::whitespace})"
                            );
    pwVar5 = std::operator<<(pwVar5,"\n");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_510);
    pwVar5 = std::operator<<(pbVar6," != ");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_540 + 8));
    pwVar5 = std::operator<<(pbVar6,"\n");
    vVar4 = tested_version();
    pbVar6 = mjs::operator<<(pwVar5,vVar4);
    std::operator<<(pbVar6,"\n");
    abort();
  }
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_540 + 8));
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_510);
  pptVar1 = &_r_8.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"x//test\n");
  lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_5e0,(wstring_view *)pptVar1);
  _l_9.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 1;
  local_698 = &local_690;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_6b8,L"x",
             (allocator<wchar_t> *)
             ((long)&_l_9.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  mjs::token::token(&local_690,identifier,&local_6b8);
  local_698 = &local_668;
  mjs::token::token(local_698,whitespace);
  local_698 = &local_640;
  mjs::token::token(local_698,line_terminator);
  _l_9.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 0;
  local_618 = &local_690;
  local_610._0_8_ = 3;
  paVar2 = (allocator<mjs::token> *)
           ((long)&_l_9.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<mjs::token>::allocator(paVar2);
  __l_30._M_len = local_610._0_8_;
  __l_30._M_array = local_618;
  std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_610 + 8),__l_30,paVar2);
  std::allocator<mjs::token>::~allocator
            ((allocator<mjs::token> *)
             ((long)&_l_9.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 5));
  local_26c8 = (token *)&local_618;
  do {
    local_26c8 = local_26c8 + -1;
    mjs::token::~token(local_26c8);
  } while (local_26c8 != &local_690);
  std::__cxx11::wstring::~wstring((wstring *)&local_6b8);
  std::allocator<wchar_t>::~allocator
            ((allocator<wchar_t> *)
             ((long)&_l_9.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_5e0,
                          (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_610 + 8));
  if (bVar3) {
    pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
    pwVar5 = std::operator<<(pwVar5," in ");
    pwVar5 = std::operator<<(pwVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                            );
    pwVar5 = std::operator<<(pwVar5,":");
    pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0x43);
    pwVar5 = std::operator<<(pwVar5,":\n");
    pwVar5 = std::operator<<(pwVar5,"lex(L\"x//test\\n\")");
    pwVar5 = std::operator<<(pwVar5," != ");
    pwVar5 = std::operator<<(pwVar5,
                             "TOKENS(token{token_type::identifier, L\"x\"}, token{token_type::whitespace}, token{token_type::line_terminator})"
                            );
    pwVar5 = std::operator<<(pwVar5,"\n");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_5e0);
    pwVar5 = std::operator<<(pbVar6," != ");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_610 + 8));
    pwVar5 = std::operator<<(pbVar6,"\n");
    vVar4 = tested_version();
    pbVar6 = mjs::operator<<(pwVar5,vVar4);
    std::operator<<(pbVar6,"\n");
    abort();
  }
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_610 + 8));
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_5e0);
  pptVar1 = &_r_9.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"for");
  lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_6d8,(wstring_view *)pptVar1);
  mjs::token::token(&local_738,for_);
  local_710 = &local_738;
  local_708._0_8_ = 1;
  paVar2 = (allocator<mjs::token> *)
           ((long)&_l_10.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<mjs::token>::allocator(paVar2);
  __l_29._M_len = local_708._0_8_;
  __l_29._M_array = local_710;
  std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_708 + 8),__l_29,paVar2);
  std::allocator<mjs::token>::~allocator
            ((allocator<mjs::token> *)
             ((long)&_l_10.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_27a0 = (token *)&local_710;
  do {
    local_27a0 = local_27a0 + -1;
    mjs::token::~token(local_27a0);
  } while (local_27a0 != &local_738);
  bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_6d8,
                          (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_708 + 8));
  if (bVar3) {
    pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
    pwVar5 = std::operator<<(pwVar5," in ");
    pwVar5 = std::operator<<(pwVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                            );
    pwVar5 = std::operator<<(pwVar5,":");
    pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0x45);
    pwVar5 = std::operator<<(pwVar5,":\n");
    pwVar5 = std::operator<<(pwVar5,"lex(LR\"(for)\")");
    pwVar5 = std::operator<<(pwVar5," != ");
    pwVar5 = std::operator<<(pwVar5,"TOKENS(token{token_type::for_})");
    pwVar5 = std::operator<<(pwVar5,"\n");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_6d8);
    pwVar5 = std::operator<<(pbVar6," != ");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_708 + 8));
    pwVar5 = std::operator<<(pbVar6,"\n");
    vVar4 = tested_version();
    pbVar6 = mjs::operator<<(pwVar5,vVar4);
    std::operator<<(pbVar6,"\n");
    abort();
  }
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_708 + 8));
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_6d8);
  pptVar1 = &_r_10.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"test");
  lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_760,(wstring_view *)pptVar1);
  _l_11.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 1;
  local_7c8 = &local_7c0;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_7e8,L"test",
             (allocator<wchar_t> *)
             ((long)&_l_11.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  mjs::token::token(&local_7c0,identifier,&local_7e8);
  _l_11.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 0;
  local_798 = &local_7c0;
  local_790._0_8_ = 1;
  paVar2 = (allocator<mjs::token> *)
           ((long)&_l_11.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<mjs::token>::allocator(paVar2);
  __l_28._M_len = local_790._0_8_;
  __l_28._M_array = local_798;
  std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_790 + 8),__l_28,paVar2);
  std::allocator<mjs::token>::~allocator
            ((allocator<mjs::token> *)
             ((long)&_l_11.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 5));
  local_2888 = (token *)&local_798;
  do {
    local_2888 = local_2888 + -1;
    mjs::token::~token(local_2888);
  } while (local_2888 != &local_7c0);
  std::__cxx11::wstring::~wstring((wstring *)&local_7e8);
  std::allocator<wchar_t>::~allocator
            ((allocator<wchar_t> *)
             ((long)&_l_11.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_760,
                          (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_790 + 8));
  if (bVar3) {
    pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
    pwVar5 = std::operator<<(pwVar5," in ");
    pwVar5 = std::operator<<(pwVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                            );
    pwVar5 = std::operator<<(pwVar5,":");
    pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0x47);
    pwVar5 = std::operator<<(pwVar5,":\n");
    pwVar5 = std::operator<<(pwVar5,"lex(LR\"(test)\")");
    pwVar5 = std::operator<<(pwVar5," != ");
    pwVar5 = std::operator<<(pwVar5,"TOKENS(token{token_type::identifier, L\"test\"})");
    pwVar5 = std::operator<<(pwVar5,"\n");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_760);
    pwVar5 = std::operator<<(pbVar6," != ");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_790 + 8));
    pwVar5 = std::operator<<(pbVar6,"\n");
    vVar4 = tested_version();
    pbVar6 = mjs::operator<<(pwVar5,vVar4);
    std::operator<<(pbVar6,"\n");
    abort();
  }
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_790 + 8));
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_760);
  pptVar1 = &_r_11.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"a b cd");
  lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_808,(wstring_view *)pptVar1);
  _l_12.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 1;
  local_910 = &local_908;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&local_930,L"a",&local_931);
  mjs::token::token(&local_908,identifier,&local_930);
  local_910 = &local_8e0;
  mjs::token::token(local_910,whitespace);
  local_910 = &local_8b8;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&local_958,L"b",&local_959);
  mjs::token::token(&local_8b8,identifier,&local_958);
  local_910 = &local_890;
  mjs::token::token(local_910,whitespace);
  local_910 = &local_868;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_980,L"cd",
             (allocator<wchar_t> *)
             ((long)&_l_12.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  mjs::token::token(&local_868,identifier,&local_980);
  _l_12.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 0;
  local_840 = &local_908;
  local_838._0_8_ = 5;
  paVar2 = (allocator<mjs::token> *)
           ((long)&_l_12.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<mjs::token>::allocator(paVar2);
  __l_27._M_len = local_838._0_8_;
  __l_27._M_array = local_840;
  std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_838 + 8),__l_27,paVar2);
  std::allocator<mjs::token>::~allocator
            ((allocator<mjs::token> *)
             ((long)&_l_12.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 5));
  local_2988 = (token *)&local_840;
  do {
    local_2988 = local_2988 + -1;
    mjs::token::~token(local_2988);
  } while (local_2988 != &local_908);
  std::__cxx11::wstring::~wstring((wstring *)&local_980);
  std::allocator<wchar_t>::~allocator
            ((allocator<wchar_t> *)
             ((long)&_l_12.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::wstring::~wstring((wstring *)&local_958);
  std::allocator<wchar_t>::~allocator(&local_959);
  std::__cxx11::wstring::~wstring((wstring *)&local_930);
  std::allocator<wchar_t>::~allocator(&local_931);
  bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_808,
                          (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_838 + 8));
  if (bVar3) {
    pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
    pwVar5 = std::operator<<(pwVar5," in ");
    pwVar5 = std::operator<<(pwVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                            );
    pwVar5 = std::operator<<(pwVar5,":");
    pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0x48);
    pwVar5 = std::operator<<(pwVar5,":\n");
    pwVar5 = std::operator<<(pwVar5,"lex(L\"a b cd\")");
    pwVar5 = std::operator<<(pwVar5," != ");
    pwVar5 = std::operator<<(pwVar5,
                             "TOKENS(token{token_type::identifier, L\"a\"}, token{token_type::whitespace}, token{token_type::identifier, L\"b\"}, token{token_type::whitespace}, token{token_type::identifier, L\"cd\"})"
                            );
    pwVar5 = std::operator<<(pwVar5,"\n");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_808);
    pwVar5 = std::operator<<(pbVar6," != ");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_838 + 8));
    pwVar5 = std::operator<<(pbVar6,"\n");
    vVar4 = tested_version();
    pbVar6 = mjs::operator<<(pwVar5,vVar4);
    std::operator<<(pbVar6,"\n");
    abort();
  }
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_838 + 8));
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_808);
  pptVar1 = &_r_12.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"$ _ $foo2_");
  lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_9a0,(wstring_view *)pptVar1);
  _l_13.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 1;
  local_aa8 = &local_aa0;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&local_ac8,L"$",&local_ac9);
  mjs::token::token(&local_aa0,identifier,&local_ac8);
  local_aa8 = &local_a78;
  mjs::token::token(local_aa8,whitespace);
  local_aa8 = &local_a50;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&local_af0,L"_",&local_af1);
  mjs::token::token(&local_a50,identifier,&local_af0);
  local_aa8 = &local_a28;
  mjs::token::token(local_aa8,whitespace);
  local_aa8 = &local_a00;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_b18,L"$foo2_",
             (allocator<wchar_t> *)
             ((long)&_l_13.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  mjs::token::token(&local_a00,identifier,&local_b18);
  _l_13.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 0;
  local_9d8 = &local_aa0;
  local_9d0._0_8_ = 5;
  paVar2 = (allocator<mjs::token> *)
           ((long)&_l_13.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<mjs::token>::allocator(paVar2);
  __l_26._M_len = local_9d0._0_8_;
  __l_26._M_array = local_9d8;
  std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_9d0 + 8),__l_26,paVar2);
  std::allocator<mjs::token>::~allocator
            ((allocator<mjs::token> *)
             ((long)&_l_13.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 5));
  local_2a88 = (token *)&local_9d8;
  do {
    local_2a88 = local_2a88 + -1;
    mjs::token::~token(local_2a88);
  } while (local_2a88 != &local_aa0);
  std::__cxx11::wstring::~wstring((wstring *)&local_b18);
  std::allocator<wchar_t>::~allocator
            ((allocator<wchar_t> *)
             ((long)&_l_13.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::wstring::~wstring((wstring *)&local_af0);
  std::allocator<wchar_t>::~allocator(&local_af1);
  std::__cxx11::wstring::~wstring((wstring *)&local_ac8);
  std::allocator<wchar_t>::~allocator(&local_ac9);
  bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_9a0,
                          (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_9d0 + 8));
  if (bVar3) {
    pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
    pwVar5 = std::operator<<(pwVar5," in ");
    pwVar5 = std::operator<<(pwVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                            );
    pwVar5 = std::operator<<(pwVar5,":");
    pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0x49);
    pwVar5 = std::operator<<(pwVar5,":\n");
    pwVar5 = std::operator<<(pwVar5,"lex(L\"$ _ $foo2_\")");
    pwVar5 = std::operator<<(pwVar5," != ");
    pwVar5 = std::operator<<(pwVar5,
                             "TOKENS(token{token_type::identifier, L\"$\"}, token{token_type::whitespace}, token{token_type::identifier, L\"_\"}, token{token_type::whitespace}, token{token_type::identifier, L\"$foo2_\"})"
                            );
    pwVar5 = std::operator<<(pwVar5,"\n");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_9a0);
    pwVar5 = std::operator<<(pbVar6," != ");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_9d0 + 8));
    pwVar5 = std::operator<<(pbVar6,"\n");
    vVar4 = tested_version();
    pbVar6 = mjs::operator<<(pwVar5,vVar4);
    std::operator<<(pbVar6,"\n");
    abort();
  }
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_9d0 + 8));
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_9a0);
  pptVar1 = &_r_13.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"1a");
  lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_b38,(wstring_view *)pptVar1);
  _l_14.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 1;
  local_bc8 = &local_bc0;
  mjs::token::token(local_bc8,1.0);
  local_bc8 = &local_b98;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_be8,L"a",
             (allocator<wchar_t> *)
             ((long)&_l_14.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  mjs::token::token(&local_b98,identifier,&local_be8);
  _l_14.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 0;
  local_b70 = &local_bc0;
  local_b68._0_8_ = 2;
  paVar2 = (allocator<mjs::token> *)
           ((long)&_l_14.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<mjs::token>::allocator(paVar2);
  __l_25._M_len = local_b68._0_8_;
  __l_25._M_array = local_b70;
  std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_b68 + 8),__l_25,paVar2);
  std::allocator<mjs::token>::~allocator
            ((allocator<mjs::token> *)
             ((long)&_l_14.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 5));
  local_2b70 = (token *)&local_b70;
  do {
    local_2b70 = local_2b70 + -1;
    mjs::token::~token(local_2b70);
  } while (local_2b70 != &local_bc0);
  std::__cxx11::wstring::~wstring((wstring *)&local_be8);
  std::allocator<wchar_t>::~allocator
            ((allocator<wchar_t> *)
             ((long)&_l_14.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_b38,
                          (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_b68 + 8));
  if (bVar3) {
    pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
    pwVar5 = std::operator<<(pwVar5," in ");
    pwVar5 = std::operator<<(pwVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                            );
    pwVar5 = std::operator<<(pwVar5,":");
    pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0x4a);
    pwVar5 = std::operator<<(pwVar5,":\n");
    pwVar5 = std::operator<<(pwVar5,"lex(L\"1a\")");
    pwVar5 = std::operator<<(pwVar5," != ");
    pwVar5 = std::operator<<(pwVar5,"TOKENS(token{1.}, token{token_type::identifier, L\"a\"})");
    pwVar5 = std::operator<<(pwVar5,"\n");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_b38);
    pwVar5 = std::operator<<(pbVar6," != ");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_b68 + 8));
    pwVar5 = std::operator<<(pbVar6,"\n");
    vVar4 = tested_version();
    pbVar6 = mjs::operator<<(pwVar5,vVar4);
    std::operator<<(pbVar6,"\n");
    abort();
  }
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_b68 + 8));
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_b38);
  pptVar1 = &_r_14.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"<<>>>=");
  lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_c08,(wstring_view *)pptVar1);
  mjs::token::token(&local_c90,lshift);
  mjs::token::token(&local_c68,rshiftshiftequal);
  local_c40 = &local_c90;
  local_c38._0_8_ = 2;
  paVar2 = (allocator<mjs::token> *)
           ((long)&_l_15.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<mjs::token>::allocator(paVar2);
  __l_24._M_len = local_c38._0_8_;
  __l_24._M_array = local_c40;
  std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_c38 + 8),__l_24,paVar2);
  std::allocator<mjs::token>::~allocator
            ((allocator<mjs::token> *)
             ((long)&_l_15.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_2c48 = (token *)&local_c40;
  do {
    local_2c48 = local_2c48 + -1;
    mjs::token::~token(local_2c48);
  } while (local_2c48 != &local_c90);
  bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_c08,
                          (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_c38 + 8));
  if (bVar3) {
    pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
    pwVar5 = std::operator<<(pwVar5," in ");
    pwVar5 = std::operator<<(pwVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                            );
    pwVar5 = std::operator<<(pwVar5,":");
    pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0x4c);
    pwVar5 = std::operator<<(pwVar5,":\n");
    pwVar5 = std::operator<<(pwVar5,"lex(LR\"(<<>>>=)\")");
    pwVar5 = std::operator<<(pwVar5," != ");
    pwVar5 = std::operator<<(pwVar5,
                             "TOKENS(token{token_type::lshift}, token{token_type::rshiftshiftequal})"
                            );
    pwVar5 = std::operator<<(pwVar5,"\n");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_c08);
    pwVar5 = std::operator<<(pbVar6," != ");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_c38 + 8));
    pwVar5 = std::operator<<(pbVar6,"\n");
    vVar4 = tested_version();
    pbVar6 = mjs::operator<<(pwVar5,vVar4);
    std::operator<<(pbVar6,"\n");
    abort();
  }
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_c38 + 8));
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_c08);
  vVar4 = tested_version();
  if (vVar4 == es1) {
    pptVar1 = &_r_15.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"= = ===");
    lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_cb8,(wstring_view *)pptVar1);
    mjs::token::token(&local_de0,equal);
    mjs::token::token(&local_db8,whitespace);
    mjs::token::token(&local_d90,equal);
    mjs::token::token(&local_d68,whitespace);
    mjs::token::token(&local_d40,equalequal);
    mjs::token::token(&local_d18,equal);
    local_cf0 = &local_de0;
    local_ce8._0_8_ = 6;
    paVar2 = (allocator<mjs::token> *)
             ((long)&_l_16.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<mjs::token>::allocator(paVar2);
    __l_23._M_len = local_ce8._0_8_;
    __l_23._M_array = local_cf0;
    std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_ce8 + 8),__l_23,paVar2);
    std::allocator<mjs::token>::~allocator
              ((allocator<mjs::token> *)
               ((long)&_l_16.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    local_2d20 = (token *)&local_cf0;
    do {
      local_2d20 = local_2d20 + -1;
      mjs::token::~token(local_2d20);
    } while (local_2d20 != &local_de0);
    bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_cb8,
                            (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_ce8 + 8));
    if (bVar3) {
      pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
      pwVar5 = std::operator<<(pwVar5," in ");
      pwVar5 = std::operator<<(pwVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                              );
      pwVar5 = std::operator<<(pwVar5,":");
      pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0x4e);
      pwVar5 = std::operator<<(pwVar5,":\n");
      pwVar5 = std::operator<<(pwVar5,"lex(LR\"(= = ===)\")");
      pwVar5 = std::operator<<(pwVar5," != ");
      pwVar5 = std::operator<<(pwVar5,
                               "TOKENS(token{token_type::equal}, token{token_type::whitespace}, token{token_type::equal}, token{token_type::whitespace}, token{token_type::equalequal}, token{token_type::equal})"
                              );
      pwVar5 = std::operator<<(pwVar5,"\n");
      pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_cb8);
      pwVar5 = std::operator<<(pbVar6," != ");
      pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_ce8 + 8))
      ;
      pwVar5 = std::operator<<(pbVar6,"\n");
      vVar4 = tested_version();
      pbVar6 = mjs::operator<<(pwVar5,vVar4);
      std::operator<<(pbVar6,"\n");
      abort();
    }
    std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_ce8 + 8));
    std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_cb8);
    pptVar1 = &_r_16.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"!==");
    lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_e08,(wstring_view *)pptVar1);
    mjs::token::token(&local_e90,notequal);
    mjs::token::token(&local_e68,equal);
    local_e40 = &local_e90;
    local_e38._0_8_ = 2;
    paVar2 = (allocator<mjs::token> *)
             ((long)&_l_17.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<mjs::token>::allocator(paVar2);
    __l_22._M_len = local_e38._0_8_;
    __l_22._M_array = local_e40;
    std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_e38 + 8),__l_22,paVar2);
    std::allocator<mjs::token>::~allocator
              ((allocator<mjs::token> *)
               ((long)&_l_17.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    local_2df8 = (token *)&local_e40;
    do {
      local_2df8 = local_2df8 + -1;
      mjs::token::~token(local_2df8);
    } while (local_2df8 != &local_e90);
    bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_e08,
                            (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_e38 + 8));
    if (bVar3) {
      pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
      pwVar5 = std::operator<<(pwVar5," in ");
      pwVar5 = std::operator<<(pwVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                              );
      pwVar5 = std::operator<<(pwVar5,":");
      pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0x4f);
      pwVar5 = std::operator<<(pwVar5,":\n");
      pwVar5 = std::operator<<(pwVar5,"lex(LR\"(!==)\")");
      pwVar5 = std::operator<<(pwVar5," != ");
      pwVar5 = std::operator<<(pwVar5,
                               "TOKENS(token{token_type::notequal}, token{token_type::equal})");
      pwVar5 = std::operator<<(pwVar5,"\n");
      pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_e08);
      pwVar5 = std::operator<<(pbVar6," != ");
      pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_e38 + 8))
      ;
      pwVar5 = std::operator<<(pbVar6,"\n");
      vVar4 = tested_version();
      pbVar6 = mjs::operator<<(pwVar5,vVar4);
      std::operator<<(pbVar6,"\n");
      abort();
    }
    std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_e38 + 8));
    std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_e08);
  }
  else {
    pptVar1 = &_r_17.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"= = ===");
    lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_eb8,(wstring_view *)pptVar1);
    mjs::token::token(&local_fb8,equal);
    mjs::token::token(&local_f90,whitespace);
    mjs::token::token(&local_f68,equal);
    mjs::token::token(&local_f40,whitespace);
    mjs::token::token(&local_f18,equalequalequal);
    local_ef0 = &local_fb8;
    local_ee8._0_8_ = 5;
    paVar2 = (allocator<mjs::token> *)
             ((long)&_l_18.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<mjs::token>::allocator(paVar2);
    __l_21._M_len = local_ee8._0_8_;
    __l_21._M_array = local_ef0;
    std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_ee8 + 8),__l_21,paVar2);
    std::allocator<mjs::token>::~allocator
              ((allocator<mjs::token> *)
               ((long)&_l_18.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    local_2ed0 = (token *)&local_ef0;
    do {
      local_2ed0 = local_2ed0 + -1;
      mjs::token::~token(local_2ed0);
    } while (local_2ed0 != &local_fb8);
    bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_eb8,
                            (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_ee8 + 8));
    if (bVar3) {
      pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
      pwVar5 = std::operator<<(pwVar5," in ");
      pwVar5 = std::operator<<(pwVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                              );
      pwVar5 = std::operator<<(pwVar5,":");
      pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0x52);
      pwVar5 = std::operator<<(pwVar5,":\n");
      pwVar5 = std::operator<<(pwVar5,"lex(LR\"(= = ===)\")");
      pwVar5 = std::operator<<(pwVar5," != ");
      pwVar5 = std::operator<<(pwVar5,
                               "TOKENS(token{token_type::equal}, token{token_type::whitespace}, token{token_type::equal}, token{token_type::whitespace}, token{token_type::equalequalequal})"
                              );
      pwVar5 = std::operator<<(pwVar5,"\n");
      pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_eb8);
      pwVar5 = std::operator<<(pbVar6," != ");
      pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_ee8 + 8))
      ;
      pwVar5 = std::operator<<(pbVar6,"\n");
      vVar4 = tested_version();
      pbVar6 = mjs::operator<<(pwVar5,vVar4);
      std::operator<<(pbVar6,"\n");
      abort();
    }
    std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_ee8 + 8));
    std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_eb8);
    pptVar1 = &_r_18.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"!==");
    lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_fe0,(wstring_view *)pptVar1);
    mjs::token::token(&local_1040,notequalequal);
    local_1018 = &local_1040;
    local_1010._0_8_ = 1;
    paVar2 = (allocator<mjs::token> *)
             ((long)&_l_19.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<mjs::token>::allocator(paVar2);
    __l_20._M_len = local_1010._0_8_;
    __l_20._M_array = local_1018;
    std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1010 + 8),__l_20,paVar2);
    std::allocator<mjs::token>::~allocator
              ((allocator<mjs::token> *)
               ((long)&_l_19.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    local_2fa8 = (token *)&local_1018;
    do {
      local_2fa8 = local_2fa8 + -1;
      mjs::token::~token(local_2fa8);
    } while (local_2fa8 != &local_1040);
    bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_fe0,
                            (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1010 + 8));
    if (bVar3) {
      pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
      pwVar5 = std::operator<<(pwVar5," in ");
      pwVar5 = std::operator<<(pwVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                              );
      pwVar5 = std::operator<<(pwVar5,":");
      pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0x53);
      pwVar5 = std::operator<<(pwVar5,":\n");
      pwVar5 = std::operator<<(pwVar5,"lex(LR\"(!==)\")");
      pwVar5 = std::operator<<(pwVar5," != ");
      pwVar5 = std::operator<<(pwVar5,"TOKENS(token{token_type::notequalequal})");
      pwVar5 = std::operator<<(pwVar5,"\n");
      pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_fe0);
      pwVar5 = std::operator<<(pbVar6," != ");
      pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1010 + 8)
                         );
      pwVar5 = std::operator<<(pbVar6,"\n");
      vVar4 = tested_version();
      pbVar6 = mjs::operator<<(pwVar5,vVar4);
      std::operator<<(pbVar6,"\n");
      abort();
    }
    std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1010 + 8));
    std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_fe0);
  }
  pptVar1 = &_r_19.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"null");
  lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1068,(wstring_view *)pptVar1);
  mjs::token::token(&local_10c8,null_);
  local_10a0 = &local_10c8;
  local_1098._0_8_ = 1;
  paVar2 = (allocator<mjs::token> *)
           ((long)&_l_20.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<mjs::token>::allocator(paVar2);
  __l_19._M_len = local_1098._0_8_;
  __l_19._M_array = local_10a0;
  std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1098 + 8),__l_19,paVar2);
  std::allocator<mjs::token>::~allocator
            ((allocator<mjs::token> *)
             ((long)&_l_20.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_3080 = (token *)&local_10a0;
  do {
    local_3080 = local_3080 + -1;
    mjs::token::~token(local_3080);
  } while (local_3080 != &local_10c8);
  bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1068,
                          (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1098 + 8));
  if (bVar3) {
    pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
    pwVar5 = std::operator<<(pwVar5," in ");
    pwVar5 = std::operator<<(pwVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                            );
    pwVar5 = std::operator<<(pwVar5,":");
    pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0x57);
    pwVar5 = std::operator<<(pwVar5,":\n");
    pwVar5 = std::operator<<(pwVar5,"lex(LR\"(null)\")");
    pwVar5 = std::operator<<(pwVar5," != ");
    pwVar5 = std::operator<<(pwVar5,"TOKENS(token{token_type::null_})");
    pwVar5 = std::operator<<(pwVar5,"\n");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_1068);
    pwVar5 = std::operator<<(pbVar6," != ");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1098 + 8));
    pwVar5 = std::operator<<(pbVar6,"\n");
    vVar4 = tested_version();
    pbVar6 = mjs::operator<<(pwVar5,vVar4);
    std::operator<<(pbVar6,"\n");
    abort();
  }
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1098 + 8));
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1068);
  pptVar1 = &_r_20.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"true");
  lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_10f0,(wstring_view *)pptVar1);
  mjs::token::token(&local_1150,true_);
  local_1128 = &local_1150;
  local_1120._0_8_ = 1;
  paVar2 = (allocator<mjs::token> *)
           ((long)&_l_21.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<mjs::token>::allocator(paVar2);
  __l_18._M_len = local_1120._0_8_;
  __l_18._M_array = local_1128;
  std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1120 + 8),__l_18,paVar2);
  std::allocator<mjs::token>::~allocator
            ((allocator<mjs::token> *)
             ((long)&_l_21.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_3158 = (token *)&local_1128;
  do {
    local_3158 = local_3158 + -1;
    mjs::token::~token(local_3158);
  } while (local_3158 != &local_1150);
  bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_10f0,
                          (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1120 + 8));
  if (bVar3) {
    pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
    pwVar5 = std::operator<<(pwVar5," in ");
    pwVar5 = std::operator<<(pwVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                            );
    pwVar5 = std::operator<<(pwVar5,":");
    pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0x59);
    pwVar5 = std::operator<<(pwVar5,":\n");
    pwVar5 = std::operator<<(pwVar5,"lex(LR\"(true)\")");
    pwVar5 = std::operator<<(pwVar5," != ");
    pwVar5 = std::operator<<(pwVar5,"TOKENS(token{token_type::true_})");
    pwVar5 = std::operator<<(pwVar5,"\n");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_10f0);
    pwVar5 = std::operator<<(pbVar6," != ");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1120 + 8));
    pwVar5 = std::operator<<(pbVar6,"\n");
    vVar4 = tested_version();
    pbVar6 = mjs::operator<<(pwVar5,vVar4);
    std::operator<<(pbVar6,"\n");
    abort();
  }
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1120 + 8));
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_10f0);
  pptVar1 = &_r_21.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"false");
  lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1178,(wstring_view *)pptVar1);
  mjs::token::token(&local_11d8,false_);
  local_11b0 = &local_11d8;
  local_11a8._0_8_ = 1;
  paVar2 = (allocator<mjs::token> *)
           ((long)&_l_22.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<mjs::token>::allocator(paVar2);
  __l_17._M_len = local_11a8._0_8_;
  __l_17._M_array = local_11b0;
  std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_11a8 + 8),__l_17,paVar2);
  std::allocator<mjs::token>::~allocator
            ((allocator<mjs::token> *)
             ((long)&_l_22.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_3230 = (token *)&local_11b0;
  do {
    local_3230 = local_3230 + -1;
    mjs::token::~token(local_3230);
  } while (local_3230 != &local_11d8);
  bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1178,
                          (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_11a8 + 8));
  if (bVar3) {
    pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
    pwVar5 = std::operator<<(pwVar5," in ");
    pwVar5 = std::operator<<(pwVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                            );
    pwVar5 = std::operator<<(pwVar5,":");
    pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0x5a);
    pwVar5 = std::operator<<(pwVar5,":\n");
    pwVar5 = std::operator<<(pwVar5,"lex(LR\"(false)\")");
    pwVar5 = std::operator<<(pwVar5," != ");
    pwVar5 = std::operator<<(pwVar5,"TOKENS(token{token_type::false_})");
    pwVar5 = std::operator<<(pwVar5,"\n");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_1178);
    pwVar5 = std::operator<<(pbVar6," != ");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_11a8 + 8));
    pwVar5 = std::operator<<(pbVar6,"\n");
    vVar4 = tested_version();
    pbVar6 = mjs::operator<<(pwVar5,vVar4);
    std::operator<<(pbVar6,"\n");
    abort();
  }
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_11a8 + 8));
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1178);
  pptVar1 = &_r_22.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"60");
  lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1200,(wstring_view *)pptVar1);
  mjs::token::token(&local_1260,60.0);
  local_1238 = &local_1260;
  local_1230._0_8_ = 1;
  paVar2 = (allocator<mjs::token> *)
           ((long)&_l_23.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<mjs::token>::allocator(paVar2);
  __l_16._M_len = local_1230._0_8_;
  __l_16._M_array = local_1238;
  std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1230 + 8),__l_16,paVar2);
  std::allocator<mjs::token>::~allocator
            ((allocator<mjs::token> *)
             ((long)&_l_23.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_3308 = (token *)&local_1238;
  do {
    local_3308 = local_3308 + -1;
    mjs::token::~token(local_3308);
  } while (local_3308 != &local_1260);
  bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1200,
                          (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1230 + 8));
  if (bVar3) {
    pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
    pwVar5 = std::operator<<(pwVar5," in ");
    pwVar5 = std::operator<<(pwVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                            );
    pwVar5 = std::operator<<(pwVar5,":");
    pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0x5c);
    pwVar5 = std::operator<<(pwVar5,":\n");
    pwVar5 = std::operator<<(pwVar5,"lex(LR\"(60)\")");
    pwVar5 = std::operator<<(pwVar5," != ");
    pwVar5 = std::operator<<(pwVar5,"TOKENS(token{60.})");
    pwVar5 = std::operator<<(pwVar5,"\n");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_1200);
    pwVar5 = std::operator<<(pbVar6," != ");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1230 + 8));
    pwVar5 = std::operator<<(pbVar6,"\n");
    vVar4 = tested_version();
    pbVar6 = mjs::operator<<(pwVar5,vVar4);
    std::operator<<(pbVar6,"\n");
    abort();
  }
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1230 + 8));
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1200);
  pptVar1 = &_r_23.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"123.123");
  lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1288,(wstring_view *)pptVar1);
  mjs::token::token(&local_12e8,123.123);
  local_12c0 = &local_12e8;
  local_12b8._0_8_ = 1;
  paVar2 = (allocator<mjs::token> *)
           ((long)&_l_24.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<mjs::token>::allocator(paVar2);
  __l_15._M_len = local_12b8._0_8_;
  __l_15._M_array = local_12c0;
  std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_12b8 + 8),__l_15,paVar2);
  std::allocator<mjs::token>::~allocator
            ((allocator<mjs::token> *)
             ((long)&_l_24.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_33e0 = (token *)&local_12c0;
  do {
    local_33e0 = local_33e0 + -1;
    mjs::token::~token(local_33e0);
  } while (local_33e0 != &local_12e8);
  bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1288,
                          (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_12b8 + 8));
  if (bVar3) {
    pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
    pwVar5 = std::operator<<(pwVar5," in ");
    pwVar5 = std::operator<<(pwVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                            );
    pwVar5 = std::operator<<(pwVar5,":");
    pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0x5d);
    pwVar5 = std::operator<<(pwVar5,":\n");
    pwVar5 = std::operator<<(pwVar5,"lex(LR\"(123.123)\")");
    pwVar5 = std::operator<<(pwVar5," != ");
    pwVar5 = std::operator<<(pwVar5,"TOKENS(token{123.123})");
    pwVar5 = std::operator<<(pwVar5,"\n");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_1288);
    pwVar5 = std::operator<<(pbVar6," != ");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_12b8 + 8));
    pwVar5 = std::operator<<(pbVar6,"\n");
    vVar4 = tested_version();
    pbVar6 = mjs::operator<<(pwVar5,vVar4);
    std::operator<<(pbVar6,"\n");
    abort();
  }
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_12b8 + 8));
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1288);
  pptVar1 = &_r_24.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"1E+309");
  lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1310,(wstring_view *)pptVar1);
  mjs::token::token(&local_1370,INFINITY);
  local_1348 = &local_1370;
  local_1340._0_8_ = 1;
  paVar2 = (allocator<mjs::token> *)
           ((long)&_l_25.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<mjs::token>::allocator(paVar2);
  __l_14._M_len = local_1340._0_8_;
  __l_14._M_array = local_1348;
  std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1340 + 8),__l_14,paVar2);
  std::allocator<mjs::token>::~allocator
            ((allocator<mjs::token> *)
             ((long)&_l_25.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_34b8 = (token *)&local_1348;
  do {
    local_34b8 = local_34b8 + -1;
    mjs::token::~token(local_34b8);
  } while (local_34b8 != &local_1370);
  bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1310,
                          (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1340 + 8));
  if (bVar3) {
    pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
    pwVar5 = std::operator<<(pwVar5," in ");
    pwVar5 = std::operator<<(pwVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                            );
    pwVar5 = std::operator<<(pwVar5,":");
    pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0x5e);
    pwVar5 = std::operator<<(pwVar5,":\n");
    pwVar5 = std::operator<<(pwVar5,"lex(LR\"(1E+309)\")");
    pwVar5 = std::operator<<(pwVar5," != ");
    pwVar5 = std::operator<<(pwVar5,"TOKENS(token{(__builtin_inff ())})");
    pwVar5 = std::operator<<(pwVar5,"\n");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_1310);
    pwVar5 = std::operator<<(pbVar6," != ");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1340 + 8));
    pwVar5 = std::operator<<(pbVar6,"\n");
    vVar4 = tested_version();
    pbVar6 = mjs::operator<<(pwVar5,vVar4);
    std::operator<<(pbVar6,"\n");
    abort();
  }
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1340 + 8));
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1310);
  pptVar1 = &_r_25.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"1E-323");
  lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1398,(wstring_view *)pptVar1);
  mjs::token::token(&local_13f8,9.88131291682493e-324);
  local_13d0 = &local_13f8;
  local_13c8._0_8_ = 1;
  paVar2 = (allocator<mjs::token> *)
           ((long)&_l_26.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<mjs::token>::allocator(paVar2);
  __l_13._M_len = local_13c8._0_8_;
  __l_13._M_array = local_13d0;
  std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_13c8 + 8),__l_13,paVar2);
  std::allocator<mjs::token>::~allocator
            ((allocator<mjs::token> *)
             ((long)&_l_26.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_3590 = (token *)&local_13d0;
  do {
    local_3590 = local_3590 + -1;
    mjs::token::~token(local_3590);
  } while (local_3590 != &local_13f8);
  bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1398,
                          (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_13c8 + 8));
  if (bVar3) {
    pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
    pwVar5 = std::operator<<(pwVar5," in ");
    pwVar5 = std::operator<<(pwVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                            );
    pwVar5 = std::operator<<(pwVar5,":");
    pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0x5f);
    pwVar5 = std::operator<<(pwVar5,":\n");
    pwVar5 = std::operator<<(pwVar5,"lex(LR\"(1E-323)\")");
    pwVar5 = std::operator<<(pwVar5," != ");
    pwVar5 = std::operator<<(pwVar5,"TOKENS(token{1e-323})");
    pwVar5 = std::operator<<(pwVar5,"\n");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_1398);
    pwVar5 = std::operator<<(pbVar6," != ");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_13c8 + 8));
    pwVar5 = std::operator<<(pbVar6,"\n");
    vVar4 = tested_version();
    pbVar6 = mjs::operator<<(pwVar5,vVar4);
    std::operator<<(pbVar6,"\n");
    abort();
  }
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_13c8 + 8));
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1398);
  pptVar1 = &_r_26.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"1E-324");
  lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1420,(wstring_view *)pptVar1);
  mjs::token::token(&local_1480,0.0);
  local_1458 = &local_1480;
  local_1450._0_8_ = 1;
  paVar2 = (allocator<mjs::token> *)
           ((long)&_l_27.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<mjs::token>::allocator(paVar2);
  __l_12._M_len = local_1450._0_8_;
  __l_12._M_array = local_1458;
  std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1450 + 8),__l_12,paVar2);
  std::allocator<mjs::token>::~allocator
            ((allocator<mjs::token> *)
             ((long)&_l_27.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_3668 = (token *)&local_1458;
  do {
    local_3668 = local_3668 + -1;
    mjs::token::~token(local_3668);
  } while (local_3668 != &local_1480);
  bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1420,
                          (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1450 + 8));
  if (bVar3) {
    pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
    pwVar5 = std::operator<<(pwVar5," in ");
    pwVar5 = std::operator<<(pwVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                            );
    pwVar5 = std::operator<<(pwVar5,":");
    pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0x60);
    pwVar5 = std::operator<<(pwVar5,":\n");
    pwVar5 = std::operator<<(pwVar5,"lex(LR\"(1E-324)\")");
    pwVar5 = std::operator<<(pwVar5," != ");
    pwVar5 = std::operator<<(pwVar5,"TOKENS(token{0})");
    pwVar5 = std::operator<<(pwVar5,"\n");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_1420);
    pwVar5 = std::operator<<(pbVar6," != ");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1450 + 8));
    pwVar5 = std::operator<<(pbVar6,"\n");
    vVar4 = tested_version();
    pbVar6 = mjs::operator<<(pwVar5,vVar4);
    std::operator<<(pbVar6,"\n");
    abort();
  }
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1450 + 8));
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1420);
  pptVar1 = &_r_27.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"42.25");
  lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_14a8,(wstring_view *)pptVar1);
  mjs::token::token(&local_1508,42.25);
  local_14e0 = &local_1508;
  local_14d8._0_8_ = 1;
  paVar2 = (allocator<mjs::token> *)
           ((long)&_l_28.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<mjs::token>::allocator(paVar2);
  __l_11._M_len = local_14d8._0_8_;
  __l_11._M_array = local_14e0;
  std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_14d8 + 8),__l_11,paVar2);
  std::allocator<mjs::token>::~allocator
            ((allocator<mjs::token> *)
             ((long)&_l_28.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_3740 = (token *)&local_14e0;
  do {
    local_3740 = local_3740 + -1;
    mjs::token::~token(local_3740);
  } while (local_3740 != &local_1508);
  bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_14a8,
                          (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_14d8 + 8));
  if (bVar3) {
    pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
    pwVar5 = std::operator<<(pwVar5," in ");
    pwVar5 = std::operator<<(pwVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                            );
    pwVar5 = std::operator<<(pwVar5,":");
    pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0x61);
    pwVar5 = std::operator<<(pwVar5,":\n");
    pwVar5 = std::operator<<(pwVar5,"lex(LR\"(42.25)\")");
    pwVar5 = std::operator<<(pwVar5," != ");
    pwVar5 = std::operator<<(pwVar5,"TOKENS(token{42.25})");
    pwVar5 = std::operator<<(pwVar5,"\n");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_14a8);
    pwVar5 = std::operator<<(pbVar6," != ");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_14d8 + 8));
    pwVar5 = std::operator<<(pbVar6,"\n");
    vVar4 = tested_version();
    pbVar6 = mjs::operator<<(pwVar5,vVar4);
    std::operator<<(pbVar6,"\n");
    abort();
  }
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_14d8 + 8));
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_14a8);
  pptVar1 = &_r_28.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"1.11e2");
  lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1530,(wstring_view *)pptVar1);
  mjs::token::token(&local_1590,111.0);
  local_1568 = &local_1590;
  local_1560._0_8_ = 1;
  paVar2 = (allocator<mjs::token> *)
           ((long)&_l_29.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<mjs::token>::allocator(paVar2);
  __l_10._M_len = local_1560._0_8_;
  __l_10._M_array = local_1568;
  std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1560 + 8),__l_10,paVar2);
  std::allocator<mjs::token>::~allocator
            ((allocator<mjs::token> *)
             ((long)&_l_29.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_3818 = (token *)&local_1568;
  do {
    local_3818 = local_3818 + -1;
    mjs::token::~token(local_3818);
  } while (local_3818 != &local_1590);
  bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1530,
                          (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1560 + 8));
  if (bVar3) {
    pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
    pwVar5 = std::operator<<(pwVar5," in ");
    pwVar5 = std::operator<<(pwVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                            );
    pwVar5 = std::operator<<(pwVar5,":");
    pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0x62);
    pwVar5 = std::operator<<(pwVar5,":\n");
    pwVar5 = std::operator<<(pwVar5,"lex(LR\"(1.11e2)\")");
    pwVar5 = std::operator<<(pwVar5," != ");
    pwVar5 = std::operator<<(pwVar5,"TOKENS(token{111})");
    pwVar5 = std::operator<<(pwVar5,"\n");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_1530);
    pwVar5 = std::operator<<(pbVar6," != ");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1560 + 8));
    pwVar5 = std::operator<<(pbVar6,"\n");
    vVar4 = tested_version();
    pbVar6 = mjs::operator<<(pwVar5,vVar4);
    std::operator<<(pbVar6,"\n");
    abort();
  }
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1560 + 8));
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1530);
  pptVar1 = &_r_29.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"0x100");
  lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_15b8,(wstring_view *)pptVar1);
  mjs::token::token(&local_1618,256.0);
  local_15f0 = &local_1618;
  local_15e8._0_8_ = 1;
  paVar2 = (allocator<mjs::token> *)
           ((long)&_l_30.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<mjs::token>::allocator(paVar2);
  __l_09._M_len = local_15e8._0_8_;
  __l_09._M_array = local_15f0;
  std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_15e8 + 8),__l_09,paVar2);
  std::allocator<mjs::token>::~allocator
            ((allocator<mjs::token> *)
             ((long)&_l_30.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_38f0 = (token *)&local_15f0;
  do {
    local_38f0 = local_38f0 + -1;
    mjs::token::~token(local_38f0);
  } while (local_38f0 != &local_1618);
  bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_15b8,
                          (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_15e8 + 8));
  if (bVar3) {
    pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
    pwVar5 = std::operator<<(pwVar5," in ");
    pwVar5 = std::operator<<(pwVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                            );
    pwVar5 = std::operator<<(pwVar5,":");
    pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,99);
    pwVar5 = std::operator<<(pwVar5,":\n");
    pwVar5 = std::operator<<(pwVar5,"lex(LR\"(0x100)\")");
    pwVar5 = std::operator<<(pwVar5," != ");
    pwVar5 = std::operator<<(pwVar5,"TOKENS(token{256})");
    pwVar5 = std::operator<<(pwVar5,"\n");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_15b8);
    pwVar5 = std::operator<<(pbVar6," != ");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_15e8 + 8));
    pwVar5 = std::operator<<(pbVar6,"\n");
    vVar4 = tested_version();
    pbVar6 = mjs::operator<<(pwVar5,vVar4);
    std::operator<<(pbVar6,"\n");
    abort();
  }
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_15e8 + 8));
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_15b8);
  pptVar1 = &_r_30.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"0123");
  lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1640,(wstring_view *)pptVar1);
  mjs::token::token(&local_16a0,83.0);
  local_1678 = &local_16a0;
  local_1670._0_8_ = 1;
  paVar2 = (allocator<mjs::token> *)
           ((long)&_l_31.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<mjs::token>::allocator(paVar2);
  __l_08._M_len = local_1670._0_8_;
  __l_08._M_array = local_1678;
  std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1670 + 8),__l_08,paVar2);
  std::allocator<mjs::token>::~allocator
            ((allocator<mjs::token> *)
             ((long)&_l_31.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_39c8 = (token *)&local_1678;
  do {
    local_39c8 = local_39c8 + -1;
    mjs::token::~token(local_39c8);
  } while (local_39c8 != &local_16a0);
  bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1640,
                          (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1670 + 8));
  if (bVar3) {
    pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
    pwVar5 = std::operator<<(pwVar5," in ");
    pwVar5 = std::operator<<(pwVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                            );
    pwVar5 = std::operator<<(pwVar5,":");
    pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,100);
    pwVar5 = std::operator<<(pwVar5,":\n");
    pwVar5 = std::operator<<(pwVar5,"lex(LR\"(0123)\")");
    pwVar5 = std::operator<<(pwVar5," != ");
    pwVar5 = std::operator<<(pwVar5,"TOKENS(token{83})");
    pwVar5 = std::operator<<(pwVar5,"\n");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_1640);
    pwVar5 = std::operator<<(pbVar6," != ");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1670 + 8));
    pwVar5 = std::operator<<(pbVar6,"\n");
    vVar4 = tested_version();
    pbVar6 = mjs::operator<<(pwVar5,vVar4);
    std::operator<<(pbVar6,"\n");
    abort();
  }
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1670 + 8));
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1640);
  pptVar1 = &_r_31.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"\'test \"\" str\'")
  ;
  lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_16c8,(wstring_view *)pptVar1);
  _l_32.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 1;
  local_1730 = &local_1728;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_1750,L"test \"\" str",
             (allocator<wchar_t> *)
             ((long)&_l_32.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  mjs::token::token(&local_1728,string_literal,&local_1750);
  _l_32.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 0;
  local_1700 = &local_1728;
  local_16f8._0_8_ = 1;
  paVar2 = (allocator<mjs::token> *)
           ((long)&_l_32.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<mjs::token>::allocator(paVar2);
  __l_07._M_len = local_16f8._0_8_;
  __l_07._M_array = local_1700;
  std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_16f8 + 8),__l_07,paVar2);
  std::allocator<mjs::token>::~allocator
            ((allocator<mjs::token> *)
             ((long)&_l_32.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 5));
  local_3aa8 = (token *)&local_1700;
  do {
    local_3aa8 = local_3aa8 + -1;
    mjs::token::~token(local_3aa8);
  } while (local_3aa8 != &local_1728);
  std::__cxx11::wstring::~wstring((wstring *)&local_1750);
  std::allocator<wchar_t>::~allocator
            ((allocator<wchar_t> *)
             ((long)&_l_32.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_16c8,
                          (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_16f8 + 8));
  if (bVar3) {
    pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
    pwVar5 = std::operator<<(pwVar5," in ");
    pwVar5 = std::operator<<(pwVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                            );
    pwVar5 = std::operator<<(pwVar5,":");
    pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0x66);
    pwVar5 = std::operator<<(pwVar5,":\n");
    pwVar5 = std::operator<<(pwVar5,"lex(LR\"(\'test \"\" str\')\")");
    pwVar5 = std::operator<<(pwVar5," != ");
    pwVar5 = std::operator<<(pwVar5,
                             "TOKENS(token{token_type::string_literal, L\"test \\\"\\\" str\"})");
    pwVar5 = std::operator<<(pwVar5,"\n");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_16c8);
    pwVar5 = std::operator<<(pbVar6," != ");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_16f8 + 8));
    pwVar5 = std::operator<<(pbVar6,"\n");
    vVar4 = tested_version();
    pbVar6 = mjs::operator<<(pwVar5,vVar4);
    std::operator<<(pbVar6,"\n");
    abort();
  }
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_16f8 + 8));
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_16c8);
  pptVar1 = &_r_32.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"\"blahblah\'\'\"");
  lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1770,(wstring_view *)pptVar1);
  _l_33.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 1;
  local_17d8 = &local_17d0;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_17f8,L"blahblah\'\'",
             (allocator<wchar_t> *)
             ((long)&_l_33.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  mjs::token::token(&local_17d0,string_literal,&local_17f8);
  _l_33.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 0;
  local_17a8 = &local_17d0;
  local_17a0._0_8_ = 1;
  paVar2 = (allocator<mjs::token> *)
           ((long)&_l_33.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<mjs::token>::allocator(paVar2);
  __l_06._M_len = local_17a0._0_8_;
  __l_06._M_array = local_17a8;
  std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_17a0 + 8),__l_06,paVar2);
  std::allocator<mjs::token>::~allocator
            ((allocator<mjs::token> *)
             ((long)&_l_33.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 5));
  local_3b88 = (token *)&local_17a8;
  do {
    local_3b88 = local_3b88 + -1;
    mjs::token::~token(local_3b88);
  } while (local_3b88 != &local_17d0);
  std::__cxx11::wstring::~wstring((wstring *)&local_17f8);
  std::allocator<wchar_t>::~allocator
            ((allocator<wchar_t> *)
             ((long)&_l_33.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1770,
                          (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_17a0 + 8));
  if (bVar3) {
    pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
    pwVar5 = std::operator<<(pwVar5," in ");
    pwVar5 = std::operator<<(pwVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                            );
    pwVar5 = std::operator<<(pwVar5,":");
    pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0x67);
    pwVar5 = std::operator<<(pwVar5,":\n");
    pwVar5 = std::operator<<(pwVar5,"lex(LR\"(\"blahblah\'\'\")\")");
    pwVar5 = std::operator<<(pwVar5," != ");
    pwVar5 = std::operator<<(pwVar5,"TOKENS(token{token_type::string_literal, L\"blahblah\'\'\"})");
    pwVar5 = std::operator<<(pwVar5,"\n");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_1770);
    pwVar5 = std::operator<<(pbVar6," != ");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_17a0 + 8));
    pwVar5 = std::operator<<(pbVar6,"\n");
    vVar4 = tested_version();
    pbVar6 = mjs::operator<<(pwVar5,vVar4);
    std::operator<<(pbVar6,"\n");
    abort();
  }
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_17a0 + 8));
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1770);
  pptVar1 = &_r_33.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,
             L"\'\\\'\\\"\\\\\\b\\f\\n\\r\\t\'");
  lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1818,(wstring_view *)pptVar1);
  local_18a2 = 1;
  local_1880 = &local_1878;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_18a0,L"\'\"\\\b\f\n\r\t",&local_18a1);
  mjs::token::token(&local_1878,string_literal,&local_18a0);
  local_18a2 = 0;
  local_1850 = &local_1878;
  local_1848._0_8_ = 1;
  std::allocator<mjs::token>::allocator(&local_18a3);
  __l_05._M_len = local_1848._0_8_;
  __l_05._M_array = local_1850;
  std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1848 + 8),__l_05,&local_18a3)
  ;
  std::allocator<mjs::token>::~allocator(&local_18a3);
  local_3c68 = (token *)&local_1850;
  do {
    local_3c68 = local_3c68 + -1;
    mjs::token::~token(local_3c68);
  } while (local_3c68 != &local_1878);
  std::__cxx11::wstring::~wstring((wstring *)&local_18a0);
  std::allocator<wchar_t>::~allocator(&local_18a1);
  bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1818,
                          (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1848 + 8));
  if (bVar3) {
    pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
    pwVar5 = std::operator<<(pwVar5," in ");
    pwVar5 = std::operator<<(pwVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                            );
    pwVar5 = std::operator<<(pwVar5,":");
    pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0x69);
    pwVar5 = std::operator<<(pwVar5,":\n");
    pwVar5 = std::operator<<(pwVar5,"lex(LR\"(\'\\\'\\\"\\\\\\b\\f\\n\\r\\t\')\")");
    pwVar5 = std::operator<<(pwVar5," != ");
    pwVar5 = std::operator<<(pwVar5,
                             "TOKENS(token{token_type::string_literal, L\"\\\'\\\"\\\\\\b\\f\\n\\r\\t\"})"
                            );
    pwVar5 = std::operator<<(pwVar5,"\n");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_1818);
    pwVar5 = std::operator<<(pbVar6," != ");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1848 + 8));
    pwVar5 = std::operator<<(pbVar6,"\n");
    vVar4 = tested_version();
    pbVar6 = mjs::operator<<(pwVar5,vVar4);
    std::operator<<(pbVar6,"\n");
    abort();
  }
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1848 + 8));
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1818);
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&line_continuation,L"\'\n\'")
  ;
  check_lex_fails_abi_cxx11_(&local_18c8,(wstring_view *)&line_continuation);
  std::__cxx11::string::~string((string *)&local_18c8);
  local_18e0 = L"\'Test\\\nblah!\'";
  vVar4 = tested_version();
  if ((int)vVar4 < 2) {
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)
               &_l_34.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,L"\'Test\\\nblah!\'");
    check_lex_fails_abi_cxx11_
              (&local_1900,
               (wstring_view *)
               &_l_34.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_1900);
  }
  else {
    pptVar1 = &_r_34.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,
               L"\'Test\\\nblah!\'");
    lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1928,(wstring_view *)pptVar1);
    vert_tab_str._6_1_ = 1;
    local_1990 = &local_1988;
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)&local_19b0,L"Testblah!",(allocator<wchar_t> *)((long)&vert_tab_str + 7));
    mjs::token::token(&local_1988,string_literal,&local_19b0);
    vert_tab_str._6_1_ = 0;
    local_1960 = &local_1988;
    local_1958._0_8_ = 1;
    std::allocator<mjs::token>::allocator((allocator<mjs::token> *)((long)&vert_tab_str + 5));
    __l_04._M_len = local_1958._0_8_;
    __l_04._M_array = local_1960;
    std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1958 + 8),__l_04,
               (allocator<mjs::token> *)((long)&vert_tab_str + 5));
    std::allocator<mjs::token>::~allocator((allocator<mjs::token> *)((long)&vert_tab_str + 5));
    local_3d48 = (token *)&local_1960;
    do {
      local_3d48 = local_3d48 + -1;
      mjs::token::~token(local_3d48);
    } while (local_3d48 != &local_1988);
    std::__cxx11::wstring::~wstring((wstring *)&local_19b0);
    std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)((long)&vert_tab_str + 7));
    bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1928,
                            (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1958 + 8));
    if (bVar3) {
      pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
      pwVar5 = std::operator<<(pwVar5," in ");
      pwVar5 = std::operator<<(pwVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                              );
      pwVar5 = std::operator<<(pwVar5,":");
      pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0x72);
      pwVar5 = std::operator<<(pwVar5,":\n");
      pwVar5 = std::operator<<(pwVar5,"lex(line_continuation)");
      pwVar5 = std::operator<<(pwVar5," != ");
      pwVar5 = std::operator<<(pwVar5,"TOKENS(token{token_type::string_literal, L\"Testblah!\"})");
      pwVar5 = std::operator<<(pwVar5,"\n");
      pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_1928);
      pwVar5 = std::operator<<(pbVar6," != ");
      pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1958 + 8)
                         );
      pwVar5 = std::operator<<(pbVar6,"\n");
      vVar4 = tested_version();
      pbVar6 = mjs::operator<<(pwVar5,vVar4);
      std::operator<<(pbVar6,"\n");
      abort();
    }
    std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1958 + 8));
    std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1928);
  }
  local_19c0 = L"\'\\v\'";
  vVar4 = tested_version();
  if (vVar4 == es1) {
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)
               &_l_35.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,L"\'\\v\'");
    check_lex_fails_abi_cxx11_
              (&local_19e0,
               (wstring_view *)
               &_l_35.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_19e0);
  }
  else {
    pptVar1 = &_r_35.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"\'\\v\'");
    lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1a08,(wstring_view *)pptVar1);
    _l_36.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    local_1a70 = &local_1a68;
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)&local_1a90,L"\v",
               (allocator<wchar_t> *)
               ((long)&_l_36.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    mjs::token::token(&local_1a68,string_literal,&local_1a90);
    _l_36.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    local_1a40 = &local_1a68;
    local_1a38._0_8_ = 1;
    paVar2 = (allocator<mjs::token> *)
             ((long)&_l_36.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 5);
    std::allocator<mjs::token>::allocator(paVar2);
    __l_03._M_len = local_1a38._0_8_;
    __l_03._M_array = local_1a40;
    std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1a38 + 8),__l_03,paVar2);
    std::allocator<mjs::token>::~allocator
              ((allocator<mjs::token> *)
               ((long)&_l_36.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 5));
    local_3e28 = (token *)&local_1a40;
    do {
      local_3e28 = local_3e28 + -1;
      mjs::token::~token(local_3e28);
    } while (local_3e28 != &local_1a68);
    std::__cxx11::wstring::~wstring((wstring *)&local_1a90);
    std::allocator<wchar_t>::~allocator
              ((allocator<wchar_t> *)
               ((long)&_l_36.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1a08,
                            (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1a38 + 8));
    if (bVar3) {
      pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
      pwVar5 = std::operator<<(pwVar5," in ");
      pwVar5 = std::operator<<(pwVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                              );
      pwVar5 = std::operator<<(pwVar5,":");
      pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0x7a);
      pwVar5 = std::operator<<(pwVar5,":\n");
      pwVar5 = std::operator<<(pwVar5,"lex(vert_tab_str)");
      pwVar5 = std::operator<<(pwVar5," != ");
      pwVar5 = std::operator<<(pwVar5,"TOKENS(token{token_type::string_literal, L\"\\x0B\"})");
      pwVar5 = std::operator<<(pwVar5,"\n");
      pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_1a08);
      pwVar5 = std::operator<<(pbVar6," != ");
      pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1a38 + 8)
                         );
      pwVar5 = std::operator<<(pbVar6,"\n");
      vVar4 = tested_version();
      pbVar6 = mjs::operator<<(pwVar5,vVar4);
      std::operator<<(pbVar6,"\n");
      abort();
    }
    std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1a38 + 8));
    std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1a08);
  }
  pptVar1 = &_r_36.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"\'\\xAB\\x0A\'");
  lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1ab0,(wstring_view *)pptVar1);
  _l_37.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 1;
  local_1b18 = &local_1b10;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_1b38,L"«\n",
             (allocator<wchar_t> *)
             ((long)&_l_37.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  mjs::token::token(&local_1b10,string_literal,&local_1b38);
  _l_37.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 0;
  local_1ae8 = &local_1b10;
  local_1ae0._0_8_ = 1;
  paVar2 = (allocator<mjs::token> *)
           ((long)&_l_37.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<mjs::token>::allocator(paVar2);
  __l_02._M_len = local_1ae0._0_8_;
  __l_02._M_array = local_1ae8;
  std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1ae0 + 8),__l_02,paVar2);
  std::allocator<mjs::token>::~allocator
            ((allocator<mjs::token> *)
             ((long)&_l_37.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 5));
  local_3f08 = (token *)&local_1ae8;
  do {
    local_3f08 = local_3f08 + -1;
    mjs::token::~token(local_3f08);
  } while (local_3f08 != &local_1b10);
  std::__cxx11::wstring::~wstring((wstring *)&local_1b38);
  std::allocator<wchar_t>::~allocator
            ((allocator<wchar_t> *)
             ((long)&_l_37.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1ab0,
                          (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1ae0 + 8));
  if (bVar3) {
    pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
    pwVar5 = std::operator<<(pwVar5," in ");
    pwVar5 = std::operator<<(pwVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                            );
    pwVar5 = std::operator<<(pwVar5,":");
    pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0x7d);
    pwVar5 = std::operator<<(pwVar5,":\n");
    pwVar5 = std::operator<<(pwVar5,"lex(LR\"(\'\\xAB\\x0A\')\")");
    pwVar5 = std::operator<<(pwVar5," != ");
    pwVar5 = std::operator<<(pwVar5,"TOKENS(token{token_type::string_literal, L\"\\xAB\\n\"})");
    pwVar5 = std::operator<<(pwVar5,"\n");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_1ab0);
    pwVar5 = std::operator<<(pbVar6," != ");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1ae0 + 8));
    pwVar5 = std::operator<<(pbVar6,"\n");
    vVar4 = tested_version();
    pbVar6 = mjs::operator<<(pwVar5,vVar4);
    std::operator<<(pbVar6,"\n");
    abort();
  }
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1ae0 + 8));
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1ab0);
  pptVar1 = &_r_37.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,
             L"\'\\7\\77\\123\\400\'");
  lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1b58,(wstring_view *)pptVar1);
  _l_38.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 1;
  local_1bc0 = &local_1bb8;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_1be0,L"\a?S 0",
             (allocator<wchar_t> *)
             ((long)&_l_38.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  mjs::token::token(&local_1bb8,string_literal,&local_1be0);
  _l_38.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 0;
  local_1b90 = &local_1bb8;
  local_1b88._0_8_ = 1;
  paVar2 = (allocator<mjs::token> *)
           ((long)&_l_38.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<mjs::token>::allocator(paVar2);
  __l_01._M_len = local_1b88._0_8_;
  __l_01._M_array = local_1b90;
  std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1b88 + 8),__l_01,paVar2);
  std::allocator<mjs::token>::~allocator
            ((allocator<mjs::token> *)
             ((long)&_l_38.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 5));
  local_3fe8 = (token *)&local_1b90;
  do {
    local_3fe8 = local_3fe8 + -1;
    mjs::token::~token(local_3fe8);
  } while (local_3fe8 != &local_1bb8);
  std::__cxx11::wstring::~wstring((wstring *)&local_1be0);
  std::allocator<wchar_t>::~allocator
            ((allocator<wchar_t> *)
             ((long)&_l_38.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1b58,
                          (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1b88 + 8));
  if (bVar3) {
    pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
    pwVar5 = std::operator<<(pwVar5," in ");
    pwVar5 = std::operator<<(pwVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                            );
    pwVar5 = std::operator<<(pwVar5,":");
    pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0x7f);
    pwVar5 = std::operator<<(pwVar5,":\n");
    pwVar5 = std::operator<<(pwVar5,"lex(LR\"(\'\\7\\77\\123\\400\')\")");
    pwVar5 = std::operator<<(pwVar5," != ");
    pwVar5 = std::operator<<(pwVar5,
                             "TOKENS(token{token_type::string_literal, L\"\\x07\\x3f\\x53\\x20\\x30\"})"
                            );
    pwVar5 = std::operator<<(pwVar5,"\n");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_1b58);
    pwVar5 = std::operator<<(pbVar6," != ");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1b88 + 8));
    pwVar5 = std::operator<<(pbVar6,"\n");
    vVar4 = tested_version();
    pbVar6 = mjs::operator<<(pwVar5,vVar4);
    std::operator<<(pbVar6,"\n");
    abort();
  }
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1b88 + 8));
  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1b58);
  pptVar1 = &_r_38.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"\'\\u1234\'");
  lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1c00,(wstring_view *)pptVar1);
  _l_39.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 1;
  local_1c68 = &local_1c60;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_1c88,L"ሴ",
             (allocator<wchar_t> *)
             ((long)&_l_39.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  mjs::token::token(&local_1c60,string_literal,&local_1c88);
  _l_39.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 0;
  local_1c38 = &local_1c60;
  local_1c30._0_8_ = 1;
  paVar2 = (allocator<mjs::token> *)
           ((long)&_l_39.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<mjs::token>::allocator(paVar2);
  __l_00._M_len = local_1c30._0_8_;
  __l_00._M_array = local_1c38;
  std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
            ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1c30 + 8),__l_00,paVar2);
  std::allocator<mjs::token>::~allocator
            ((allocator<mjs::token> *)
             ((long)&_l_39.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 5));
  local_40c8 = (token *)&local_1c38;
  do {
    local_40c8 = local_40c8 + -1;
    mjs::token::~token(local_40c8);
  } while (local_40c8 != &local_1c60);
  std::__cxx11::wstring::~wstring((wstring *)&local_1c88);
  std::allocator<wchar_t>::~allocator
            ((allocator<wchar_t> *)
             ((long)&_l_39.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1c00,
                          (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1c30 + 8));
  if (!bVar3) {
    std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1c30 + 8));
    std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1c00);
    pptVar1 = &_r_39.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,
               L"if (1) foo[\'x\']=bar();");
    lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1ca8,(wstring_view *)pptVar1);
    local_1fb2 = 1;
    local_1f40 = &local_1f38;
    mjs::token::token(local_1f40,if_);
    local_1f40 = &local_1f10;
    mjs::token::token(local_1f40,whitespace);
    local_1f40 = &local_1ee8;
    mjs::token::token(local_1f40,lparen);
    local_1f40 = &local_1ec0;
    mjs::token::token(local_1f40,1.0);
    local_1f40 = &local_1e98;
    mjs::token::token(local_1f40,rparen);
    local_1f40 = &local_1e70;
    mjs::token::token(local_1f40,whitespace);
    local_1f40 = &local_1e48;
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)&local_1f60,L"foo",&local_1f61);
    mjs::token::token(&local_1e48,identifier,&local_1f60);
    local_1f40 = &local_1e20;
    mjs::token::token(local_1f40,lbracket);
    local_1f40 = &local_1df8;
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&local_1f88,L"x",&local_1f89)
    ;
    mjs::token::token(&local_1df8,string_literal,&local_1f88);
    local_1f40 = &local_1dd0;
    mjs::token::token(local_1f40,rbracket);
    local_1f40 = &local_1da8;
    mjs::token::token(local_1f40,equal);
    local_1f40 = &local_1d80;
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)&local_1fb0,L"bar",&local_1fb1);
    mjs::token::token(&local_1d80,identifier,&local_1fb0);
    local_1f40 = &local_1d58;
    mjs::token::token(local_1f40,lparen);
    local_1f40 = &local_1d30;
    mjs::token::token(local_1f40,rparen);
    local_1f40 = &local_1d08;
    mjs::token::token(local_1f40,semicolon);
    local_1fb2 = 0;
    local_1ce0 = &local_1f38;
    local_1cd8._0_8_ = 0xf;
    std::allocator<mjs::token>::allocator(&local_1fb3);
    __l._M_len = local_1cd8._0_8_;
    __l._M_array = local_1ce0;
    std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1cd8 + 8),__l,&local_1fb3);
    std::allocator<mjs::token>::~allocator(&local_1fb3);
    local_41d0 = (token *)&local_1ce0;
    do {
      local_41d0 = local_41d0 + -1;
      mjs::token::~token(local_41d0);
    } while (local_41d0 != &local_1f38);
    std::__cxx11::wstring::~wstring((wstring *)&local_1fb0);
    std::allocator<wchar_t>::~allocator(&local_1fb1);
    std::__cxx11::wstring::~wstring((wstring *)&local_1f88);
    std::allocator<wchar_t>::~allocator(&local_1f89);
    std::__cxx11::wstring::~wstring((wstring *)&local_1f60);
    std::allocator<wchar_t>::~allocator(&local_1f61);
    bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1ca8,
                            (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1cd8 + 8));
    if (!bVar3) {
      std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
                ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1cd8 + 8));
      std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
                ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1ca8);
      return;
    }
    pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
    pwVar5 = std::operator<<(pwVar5," in ");
    pwVar5 = std::operator<<(pwVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                            );
    pwVar5 = std::operator<<(pwVar5,":");
    pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0x84);
    pwVar5 = std::operator<<(pwVar5,":\n");
    pwVar5 = std::operator<<(pwVar5,"lex(LR\"(if (1) foo[\'x\']=bar();)\")");
    pwVar5 = std::operator<<(pwVar5," != ");
    pwVar5 = std::operator<<(pwVar5,
                             "TOKENS(token{token_type::if_}, token{token_type::whitespace}, token{token_type::lparen}, token{1.}, token{token_type::rparen}, token{token_type::whitespace}, token{token_type::identifier, L\"foo\"}, token{token_type::lbracket}, token{token_type::string_literal, L\"x\"}, token{token_type::rbracket}, token{token_type::equal}, token{token_type::identifier, L\"bar\"}, token{token_type::lparen}, token{token_type::rparen}, token{token_type::semicolon})"
                            );
    pwVar5 = std::operator<<(pwVar5,"\n");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_1ca8);
    pwVar5 = std::operator<<(pbVar6," != ");
    pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1cd8 + 8));
    pwVar5 = std::operator<<(pbVar6,"\n");
    vVar4 = tested_version();
    pbVar6 = mjs::operator<<(pwVar5,vVar4);
    std::operator<<(pbVar6,"\n");
    abort();
  }
  pwVar5 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
  pwVar5 = std::operator<<(pwVar5," in ");
  pwVar5 = std::operator<<(pwVar5,
                           "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                          );
  pwVar5 = std::operator<<(pwVar5,":");
  pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0x81);
  pwVar5 = std::operator<<(pwVar5,":\n");
  pwVar5 = std::operator<<(pwVar5,"lex(LR\"(\'\\u1234\')\")");
  pwVar5 = std::operator<<(pwVar5," != ");
  pwVar5 = std::operator<<(pwVar5,"TOKENS(token{token_type::string_literal, L\"\\x1234\"})");
  pwVar5 = std::operator<<(pwVar5,"\n");
  pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_1c00);
  pwVar5 = std::operator<<(pbVar6," != ");
  pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1c30 + 8));
  pwVar5 = std::operator<<(pbVar6,"\n");
  vVar4 = tested_version();
  pbVar6 = mjs::operator<<(pwVar5,vVar4);
  std::operator<<(pbVar6,"\n");
  abort();
}

Assistant:

void basic_tests() {
    // Whitespace
    SIMPLE_TEST(L"\x09\x0b\x0c\x20 ab", WS, ID("ab"));
    if (tested_version() > version::es1) {
        // <NBSP> + <USP> are considered whitespace in ES3+
        SIMPLE_TEST(L"\xA0\x1680\x2000", WS);
    }
    // Line terminators
    SIMPLE_TEST(L"\012x\015", NL, ID("x"), NL);
    if (tested_version() > version::es1) {
        // In ES3+ \u2028 and \u2029 are considered line terminators
        SIMPLE_TEST(L"\x2028\x2029", NL);
        SIMPLE_TEST(L"x//\x2029", ID("x"), WS, NL);
    }
    // Comments
    SIMPLE_TEST(L"/*hello world!*/", WS);
    SIMPLE_TEST(L"/*hello\nworld!*/", NL);
    SIMPLE_TEST(L"x//test", ID("x"), WS);
    SIMPLE_TEST(L"x//test\n", ID("x"), WS, NL);
    // Reserver word
    SIMPLE_TEST(LR"(for)", T(for_));
    // Identifier
    SIMPLE_TEST(LR"(test)", ID("test"));
    SIMPLE_TEST(L"a b cd", ID("a"), WS, ID("b"), WS, ID("cd"));
    SIMPLE_TEST(L"$ _ $foo2_", ID("$"), WS, ID("_"), WS, ID("$foo2_"));
    SIMPLE_TEST(L"1a", token{1.}, ID("a"));
    // Punctuator
    SIMPLE_TEST(LR"(<<>>>=)", T(lshift), T(rshiftshiftequal));
    if (tested_version() == version::es1) {
        SIMPLE_TEST(LR"(= = ===)", T(equal), WS, T(equal), WS, T(equalequal), T(equal));
        SIMPLE_TEST(LR"(!==)", T(notequal), T(equal));
    } else {
        // ===/ !== are new in ES3
        SIMPLE_TEST(LR"(= = ===)", T(equal), WS, T(equal), WS, T(equalequalequal));
        SIMPLE_TEST(LR"(!==)", T(notequalequal));
    }
    // Literal
    //  - null literal
    SIMPLE_TEST(LR"(null)", T(null_));
    //  - boolean literals
    SIMPLE_TEST(LR"(true)", T(true_));
    SIMPLE_TEST(LR"(false)", T(false_));
    //  - numeric literal
    SIMPLE_TEST(LR"(60)", token{60.});
    SIMPLE_TEST(LR"(123.123)", token{123.123});
    SIMPLE_TEST(LR"(1E+309)", token{INFINITY});
    SIMPLE_TEST(LR"(1E-323)", token{1e-323});
    SIMPLE_TEST(LR"(1E-324)", token{0});
    SIMPLE_TEST(LR"(42.25)", token{42.25});
    SIMPLE_TEST(LR"(1.11e2)", token{111});
    SIMPLE_TEST(LR"(0x100)", token{256});
    SIMPLE_TEST(LR"(0123)", token{83});
    //  - string literal
    SIMPLE_TEST(LR"('test "" str')", STR("test \"\" str"));
    SIMPLE_TEST(LR"("blahblah''")", STR("blahblah''"));
    //      SingleEscapeCharacter
    SIMPLE_TEST(LR"('\'\"\\\b\f\n\r\t')", STR("\'\"\\\b\f\n\r\t"));

    check_lex_fails(L"'\n'"); // an unescaped line terminator cannot appear in a string literal in any version

    // Line continutations aren't supported until ES5
    const auto line_continuation = L"'Test\\\nblah!'";
    if (tested_version() < version::es5) {
        check_lex_fails(line_continuation);
    } else {
        SIMPLE_TEST(line_continuation, STR("Testblah!"));
    }

    // Vertical tab (<VT>) supported from es3 on
    const auto vert_tab_str = LR"('\v')";
    if (tested_version() == version::es1) {
        check_lex_fails(vert_tab_str);
    } else {
        SIMPLE_TEST(vert_tab_str, STR("\x0B"));
    }
    //      HexEscapeSequence
    SIMPLE_TEST(LR"('\xAB\x0A')", STR("\xAB\n"));
    //      OctalEscapeSequence
    SIMPLE_TEST(LR"('\7\77\123\400')", STR("\x07\x3f\x53\x20\x30"));
    //      UnicodeEscapeSequence
    SIMPLE_TEST(LR"('\u1234')", STR("\x1234"));

    // A combined example
    SIMPLE_TEST(LR"(if (1) foo['x']=bar();)", T(if_), WS, T(lparen), token{1.}, T(rparen), WS, ID("foo"), T(lbracket), STR("x"), T(rbracket), T(equal), ID("bar"), T(lparen), T(rparen), T(semicolon));
}